

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersector1<4>::
     intersect_h<embree::avx2::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  uint uVar60;
  ulong uVar61;
  long lVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  undefined4 uVar66;
  uint uVar67;
  undefined8 unaff_R13;
  bool bVar68;
  undefined8 uVar69;
  vint4 bi_2;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar76 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar96;
  float fVar122;
  float fVar123;
  vint4 bi_1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar124;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar164;
  vint4 ai_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar160 [32];
  float fVar165;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 ai;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar187;
  float fVar201;
  float fVar202;
  vint4 bi;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  vint4 ai_1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar226;
  undefined1 auVar225 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar246;
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar252;
  undefined1 auVar250 [64];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [32];
  RTCFilterFunctionNArguments local_a78;
  int local_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined8 local_930;
  float local_928;
  float local_924;
  undefined4 local_920;
  uint local_91c;
  uint local_918;
  uint local_914;
  uint local_910;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined8 local_840;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  float local_800;
  float fStack_7fc;
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 auStack_770 [16];
  undefined1 local_760 [16];
  Primitive *local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  float fStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar3 = prim[1];
  uVar61 = (ulong)(byte)PVar3;
  fVar96 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar8 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                      *(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar70._0_4_ = fVar96 * auVar8._0_4_;
  auVar70._4_4_ = fVar96 * auVar8._4_4_;
  auVar70._8_4_ = fVar96 * auVar8._8_4_;
  auVar70._12_4_ = fVar96 * auVar8._12_4_;
  auVar188._0_4_ = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar188._4_4_ = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar188._8_4_ = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar188._12_4_ = fVar96 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar172 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar172 = vcvtdq2ps_avx(auVar172);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xc + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xd + 6)));
  auVar218 = vcvtdq2ps_avx(auVar218);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x12 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x13 + 6)));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0x14 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar258._4_4_ = auVar188._0_4_;
  auVar258._0_4_ = auVar188._0_4_;
  auVar258._8_4_ = auVar188._0_4_;
  auVar258._12_4_ = auVar188._0_4_;
  auVar98 = vshufps_avx(auVar188,auVar188,0x55);
  auVar71 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar96 = auVar71._0_4_;
  auVar233._0_4_ = fVar96 * auVar172._0_4_;
  fVar122 = auVar71._4_4_;
  auVar233._4_4_ = fVar122 * auVar172._4_4_;
  fVar123 = auVar71._8_4_;
  auVar233._8_4_ = fVar123 * auVar172._8_4_;
  fVar124 = auVar71._12_4_;
  auVar233._12_4_ = fVar124 * auVar172._12_4_;
  auVar227._0_4_ = auVar218._0_4_ * fVar96;
  auVar227._4_4_ = auVar218._4_4_ * fVar122;
  auVar227._8_4_ = auVar218._8_4_ * fVar123;
  auVar227._12_4_ = auVar218._12_4_ * fVar124;
  auVar216._0_4_ = auVar130._0_4_ * fVar96;
  auVar216._4_4_ = auVar130._4_4_ * fVar122;
  auVar216._8_4_ = auVar130._8_4_ * fVar123;
  auVar216._12_4_ = auVar130._12_4_ * fVar124;
  auVar71 = vfmadd231ps_fma(auVar233,auVar98,auVar7);
  auVar128 = vfmadd231ps_fma(auVar227,auVar98,auVar78);
  auVar98 = vfmadd231ps_fma(auVar216,auVar72,auVar98);
  auVar145 = vfmadd231ps_fma(auVar71,auVar258,auVar8);
  auVar128 = vfmadd231ps_fma(auVar128,auVar258,auVar194);
  auVar170 = vfmadd231ps_fma(auVar98,auVar73,auVar258);
  auVar259._4_4_ = auVar70._0_4_;
  auVar259._0_4_ = auVar70._0_4_;
  auVar259._8_4_ = auVar70._0_4_;
  auVar259._12_4_ = auVar70._0_4_;
  auVar98 = vshufps_avx(auVar70,auVar70,0x55);
  auVar71 = vshufps_avx(auVar70,auVar70,0xaa);
  fVar96 = auVar71._0_4_;
  auVar189._0_4_ = fVar96 * auVar172._0_4_;
  fVar122 = auVar71._4_4_;
  auVar189._4_4_ = fVar122 * auVar172._4_4_;
  fVar123 = auVar71._8_4_;
  auVar189._8_4_ = fVar123 * auVar172._8_4_;
  fVar124 = auVar71._12_4_;
  auVar189._12_4_ = fVar124 * auVar172._12_4_;
  auVar97._0_4_ = auVar218._0_4_ * fVar96;
  auVar97._4_4_ = auVar218._4_4_ * fVar122;
  auVar97._8_4_ = auVar218._8_4_ * fVar123;
  auVar97._12_4_ = auVar218._12_4_ * fVar124;
  auVar71._0_4_ = auVar130._0_4_ * fVar96;
  auVar71._4_4_ = auVar130._4_4_ * fVar122;
  auVar71._8_4_ = auVar130._8_4_ * fVar123;
  auVar71._12_4_ = auVar130._12_4_ * fVar124;
  auVar7 = vfmadd231ps_fma(auVar189,auVar98,auVar7);
  auVar172 = vfmadd231ps_fma(auVar97,auVar98,auVar78);
  auVar78 = vfmadd231ps_fma(auVar71,auVar98,auVar72);
  auVar218 = vfmadd231ps_fma(auVar7,auVar259,auVar8);
  auVar72 = vfmadd231ps_fma(auVar172,auVar259,auVar194);
  auVar130 = vfmadd231ps_fma(auVar78,auVar259,auVar73);
  local_9f0._8_4_ = 0x7fffffff;
  local_9f0._0_8_ = 0x7fffffff7fffffff;
  local_9f0._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar145,local_9f0);
  auVar169._8_4_ = 0x219392ef;
  auVar169._0_8_ = 0x219392ef219392ef;
  auVar169._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar169,1);
  auVar7 = vblendvps_avx(auVar145,auVar169,auVar8);
  auVar8 = vandps_avx(auVar128,local_9f0);
  auVar8 = vcmpps_avx(auVar8,auVar169,1);
  auVar172 = vblendvps_avx(auVar128,auVar169,auVar8);
  auVar8 = vandps_avx(local_9f0,auVar170);
  auVar8 = vcmpps_avx(auVar8,auVar169,1);
  auVar8 = vblendvps_avx(auVar170,auVar169,auVar8);
  auVar194 = vrcpps_avx(auVar7);
  auVar217._8_4_ = 0x3f800000;
  auVar217._0_8_ = 0x3f8000003f800000;
  auVar217._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar194,auVar217);
  auVar194 = vfmadd132ps_fma(auVar7,auVar194,auVar194);
  auVar7 = vrcpps_avx(auVar172);
  auVar172 = vfnmadd213ps_fma(auVar172,auVar7,auVar217);
  auVar78 = vfmadd132ps_fma(auVar172,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar8);
  auVar172 = vfnmadd213ps_fma(auVar8,auVar7,auVar217);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar73 = vfmadd132ps_fma(auVar172,auVar7,auVar7);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar218);
  auVar170._0_4_ = auVar194._0_4_ * auVar8._0_4_;
  auVar170._4_4_ = auVar194._4_4_ * auVar8._4_4_;
  auVar170._8_4_ = auVar194._8_4_ * auVar8._8_4_;
  auVar170._12_4_ = auVar194._12_4_ * auVar8._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar7);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar8,auVar218);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = *(ulong *)(prim + uVar61 * 0xe + 6);
  auVar8 = vpmovsxwd_avx(auVar172);
  auVar190._0_4_ = auVar194._0_4_ * auVar7._0_4_;
  auVar190._4_4_ = auVar194._4_4_ * auVar7._4_4_;
  auVar190._8_4_ = auVar194._8_4_ * auVar7._8_4_;
  auVar190._12_4_ = auVar194._12_4_ * auVar7._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar72);
  auVar207._0_4_ = auVar78._0_4_ * auVar8._0_4_;
  auVar207._4_4_ = auVar78._4_4_ * auVar8._4_4_;
  auVar207._8_4_ = auVar78._8_4_ * auVar8._8_4_;
  auVar207._12_4_ = auVar78._12_4_ * auVar8._12_4_;
  auVar128._1_3_ = 0;
  auVar128[0] = PVar3;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar8 = vpmovsxwd_avx(auVar194);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar72);
  auVar98._0_4_ = auVar78._0_4_ * auVar8._0_4_;
  auVar98._4_4_ = auVar78._4_4_ * auVar8._4_4_;
  auVar98._8_4_ = auVar78._8_4_ * auVar8._8_4_;
  auVar98._12_4_ = auVar78._12_4_ * auVar8._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar61 * 0x15 + 6);
  auVar8 = vpmovsxwd_avx(auVar78);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar7 = vsubps_avx(auVar8,auVar130);
  local_748 = prim;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar218);
  auVar145._0_4_ = auVar73._0_4_ * auVar7._0_4_;
  auVar145._4_4_ = auVar73._4_4_ * auVar7._4_4_;
  auVar145._8_4_ = auVar73._8_4_ * auVar7._8_4_;
  auVar145._12_4_ = auVar73._12_4_ * auVar7._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar130);
  auVar72._0_4_ = auVar73._0_4_ * auVar8._0_4_;
  auVar72._4_4_ = auVar73._4_4_ * auVar8._4_4_;
  auVar72._8_4_ = auVar73._8_4_ * auVar8._8_4_;
  auVar72._12_4_ = auVar73._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar170,auVar190);
  auVar7 = vpminsd_avx(auVar207,auVar98);
  auVar8 = vmaxps_avx(auVar8,auVar7);
  auVar7 = vpminsd_avx(auVar145,auVar72);
  uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar228._4_4_ = uVar66;
  auVar228._0_4_ = uVar66;
  auVar228._8_4_ = uVar66;
  auVar228._12_4_ = uVar66;
  auVar7 = vmaxps_avx(auVar7,auVar228);
  auVar8 = vmaxps_avx(auVar8,auVar7);
  local_4c0._0_4_ = auVar8._0_4_ * 0.99999964;
  local_4c0._4_4_ = auVar8._4_4_ * 0.99999964;
  local_4c0._8_4_ = auVar8._8_4_ * 0.99999964;
  local_4c0._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar170,auVar190);
  auVar7 = vpmaxsd_avx(auVar207,auVar98);
  auVar8 = vminps_avx(auVar8,auVar7);
  auVar7 = vpmaxsd_avx(auVar145,auVar72);
  fVar96 = (ray->super_RayK<1>).tfar;
  auVar130._4_4_ = fVar96;
  auVar130._0_4_ = fVar96;
  auVar130._8_4_ = fVar96;
  auVar130._12_4_ = fVar96;
  auVar7 = vminps_avx(auVar7,auVar130);
  auVar8 = vminps_avx(auVar8,auVar7);
  auVar128[4] = PVar3;
  auVar128._5_3_ = 0;
  auVar128[8] = PVar3;
  auVar128._9_3_ = 0;
  auVar128[0xc] = PVar3;
  auVar128._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar128,_DAT_01f4ad30);
  auVar73._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar73._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar73._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar73._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar8 = vcmpps_avx(local_4c0,auVar73,2);
  auVar8 = vandps_avx(auVar8,auVar7);
  uVar66 = vmovmskps_avx(auVar8);
  uVar61 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar66);
  auVar85._16_16_ = mm_lookupmask_ps._240_16_;
  auVar85._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar85,ZEXT832(0) << 0x20,0x80);
  auVar239 = ZEXT3264(_DAT_01f7b040);
LAB_0113989b:
  if (uVar61 == 0) {
    return;
  }
  lVar62 = 0;
  for (uVar64 = uVar61; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar62 = lVar62 + 1;
  }
  uVar67 = *(uint *)(local_748 + 2);
  pGVar4 = (context->scene->geometries).items[uVar67].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(local_748 + lVar62 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar8 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar64);
  auVar7 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * (uVar64 + 1));
  auVar74._8_4_ = 0xbeaaaaab;
  auVar74._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar74._12_4_ = 0xbeaaaaab;
  auVar73 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              uVar64 * (long)pGVar4[2].pointQueryFunc),auVar8,auVar74);
  auVar218 = vfmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              (long)pGVar4[2].pointQueryFunc * (uVar64 + 1)),auVar7,auVar74);
  auVar191._0_4_ = (auVar7._0_4_ + auVar8._0_4_ + auVar73._0_4_ + auVar218._0_4_) * 0.25;
  auVar191._4_4_ = (auVar7._4_4_ + auVar8._4_4_ + auVar73._4_4_ + auVar218._4_4_) * 0.25;
  auVar191._8_4_ = (auVar7._8_4_ + auVar8._8_4_ + auVar73._8_4_ + auVar218._8_4_) * 0.25;
  auVar191._12_4_ = (auVar7._12_4_ + auVar8._12_4_ + auVar73._12_4_ + auVar218._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar172 = vsubps_avx(auVar191,(undefined1  [16])aVar1);
  auVar172 = vdpps_avx(auVar172,(undefined1  [16])aVar2,0x7f);
  auVar194 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar78 = vrcpss_avx(auVar194,auVar194);
  auVar225 = ZEXT1664(auVar78);
  auVar194 = vfnmadd213ss_fma(auVar78,auVar194,ZEXT416(0x40000000));
  fVar96 = auVar172._0_4_ * auVar78._0_4_ * auVar194._0_4_;
  local_760 = ZEXT416((uint)fVar96);
  auVar192._4_4_ = fVar96;
  auVar192._0_4_ = fVar96;
  auVar192._8_4_ = fVar96;
  auVar192._12_4_ = fVar96;
  fStack_5f0 = fVar96;
  _local_600 = auVar192;
  fStack_5ec = fVar96;
  fStack_5e8 = fVar96;
  fStack_5e4 = fVar96;
  auVar172 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar192);
  auVar172 = vblendps_avx(auVar172,_DAT_01f45a50,8);
  local_9b0 = vsubps_avx(auVar8,auVar172);
  local_9c0 = vsubps_avx(auVar218,auVar172);
  local_9d0 = vsubps_avx(auVar73,auVar172);
  _local_9e0 = vsubps_avx(auVar7,auVar172);
  auVar8 = vmovshdup_avx(local_9b0);
  uVar69 = auVar8._0_8_;
  auVar247._8_8_ = uVar69;
  auVar247._0_8_ = uVar69;
  auVar247._16_8_ = uVar69;
  auVar247._24_8_ = uVar69;
  auVar8 = vshufps_avx(local_9b0,local_9b0,0xaa);
  uVar69 = auVar8._0_8_;
  auVar137._8_8_ = uVar69;
  auVar137._0_8_ = uVar69;
  auVar137._16_8_ = uVar69;
  auVar137._24_8_ = uVar69;
  auVar8 = vshufps_avx(local_9b0,local_9b0,0xff);
  uVar69 = auVar8._0_8_;
  auVar240._8_8_ = uVar69;
  auVar240._0_8_ = uVar69;
  auVar240._16_8_ = uVar69;
  auVar240._24_8_ = uVar69;
  auVar8 = vmovshdup_avx(local_9d0);
  uVar69 = auVar8._0_8_;
  auVar248._8_8_ = uVar69;
  auVar248._0_8_ = uVar69;
  auVar248._16_8_ = uVar69;
  auVar248._24_8_ = uVar69;
  auVar8 = vshufps_avx(local_9d0,local_9d0,0xaa);
  uVar69 = auVar8._0_8_;
  auVar241._8_8_ = uVar69;
  auVar241._0_8_ = uVar69;
  auVar241._16_8_ = uVar69;
  auVar241._24_8_ = uVar69;
  auVar7 = vshufps_avx(local_9d0,local_9d0,0xff);
  uVar69 = auVar7._0_8_;
  auVar260._8_8_ = uVar69;
  auVar260._0_8_ = uVar69;
  auVar260._16_8_ = uVar69;
  auVar260._24_8_ = uVar69;
  auVar8 = vmovshdup_avx(local_9c0);
  local_800 = auVar8._0_4_;
  fStack_7fc = auVar8._4_4_;
  auVar8 = vshufps_avx(local_9c0,local_9c0,0xaa);
  uVar69 = auVar8._0_8_;
  local_7c0._8_8_ = uVar69;
  local_7c0._0_8_ = uVar69;
  local_7c0._16_8_ = uVar69;
  local_7c0._24_8_ = uVar69;
  auVar8 = vshufps_avx(local_9c0,local_9c0,0xff);
  local_3e0 = auVar8._0_4_;
  fStack_3dc = auVar8._4_4_;
  auVar8 = vmovshdup_avx(_local_9e0);
  local_1e0 = auVar8._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar8 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  local_200 = auVar8._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar8 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  local_220 = auVar8._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar75._0_4_ = aVar2.x * aVar2.x;
  auVar75._4_4_ = aVar2.y * aVar2.y;
  auVar75._8_4_ = aVar2.z * aVar2.z;
  auVar75._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar8 = vshufps_avx(auVar75,auVar75,0xaa);
  uVar69 = auVar8._0_8_;
  auVar111._8_8_ = uVar69;
  auVar111._0_8_ = uVar69;
  auVar111._16_8_ = uVar69;
  auVar111._24_8_ = uVar69;
  uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_4e0._4_4_ = uVar66;
  local_4e0._0_4_ = uVar66;
  fStack_4d8 = (float)uVar66;
  fStack_4d4 = (float)uVar66;
  fStack_4d0 = (float)uVar66;
  fStack_4cc = (float)uVar66;
  fStack_4c8 = (float)uVar66;
  register0x0000121c = uVar66;
  auVar8 = vfmadd231ps_fma(auVar111,_local_4e0,_local_4e0);
  uVar66 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_500._4_4_ = uVar66;
  local_500._0_4_ = uVar66;
  fStack_4f8 = (float)uVar66;
  fStack_4f4 = (float)uVar66;
  fStack_4f0 = (float)uVar66;
  fStack_4ec = (float)uVar66;
  fStack_4e8 = (float)uVar66;
  register0x0000121c = uVar66;
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_500,_local_500);
  uVar65 = 0;
  local_aec = 1;
  local_620 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  uVar66 = local_9b0._0_4_;
  auVar178._4_4_ = uVar66;
  auVar178._0_4_ = uVar66;
  auVar178._8_4_ = uVar66;
  auVar178._12_4_ = uVar66;
  auVar178._16_4_ = uVar66;
  auVar178._20_4_ = uVar66;
  auVar178._24_4_ = uVar66;
  auVar178._28_4_ = uVar66;
  uVar66 = local_9d0._0_4_;
  auVar134._4_4_ = uVar66;
  auVar134._0_4_ = uVar66;
  auVar134._8_4_ = uVar66;
  auVar134._12_4_ = uVar66;
  auVar134._16_4_ = uVar66;
  auVar134._20_4_ = uVar66;
  auVar134._24_4_ = uVar66;
  auVar134._28_4_ = uVar66;
  local_360._0_4_ = local_9c0._0_4_;
  local_360._4_4_ = local_360._0_4_;
  local_360._8_4_ = local_360._0_4_;
  local_360._12_4_ = local_360._0_4_;
  local_360._16_4_ = local_360._0_4_;
  local_360._20_4_ = local_360._0_4_;
  local_360._24_4_ = local_360._0_4_;
  local_360._28_4_ = local_360._0_4_;
  local_260 = local_9e0._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_640._8_4_ = 0x7fffffff;
  local_640._0_8_ = 0x7fffffff7fffffff;
  local_640._12_4_ = 0x7fffffff;
  local_640._16_4_ = 0x7fffffff;
  local_640._20_4_ = 0x7fffffff;
  local_640._24_4_ = 0x7fffffff;
  local_640._28_4_ = 0x7fffffff;
  local_240 = ZEXT1632(auVar8);
  local_420 = vandps_avx(ZEXT1632(auVar8),local_640);
  local_4b0 = ZEXT816(0x3f80000000000000);
  local_400 = auVar247;
  local_320 = auVar137;
  local_340 = auVar240;
  local_8a0 = auVar248;
  local_8c0 = auVar241;
  local_a40 = auVar178;
  local_8e0 = auVar134;
  uVar64 = (ulong)*(uint *)(local_748 + lVar62 * 4 + 6);
  fStack_7f8 = local_800;
  fStack_7f4 = fStack_7fc;
  fStack_7f0 = local_800;
  fStack_7ec = fStack_7fc;
  fStack_7e8 = local_800;
  fStack_7e4 = fStack_7fc;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  do {
    auVar8 = vmovshdup_avx(local_4b0);
    auVar8 = vsubps_avx(auVar8,local_4b0);
    fVar125 = auVar8._0_4_;
    fVar127 = fVar125 * 0.04761905;
    local_900._0_4_ = local_4b0._0_4_;
    local_900._4_4_ = local_900._0_4_;
    local_900._8_4_ = local_900._0_4_;
    local_900._12_4_ = local_900._0_4_;
    local_900._16_4_ = local_900._0_4_;
    local_900._20_4_ = local_900._0_4_;
    local_900._24_4_ = local_900._0_4_;
    local_900._28_4_ = local_900._0_4_;
    local_680._4_4_ = fVar125;
    local_680._0_4_ = fVar125;
    local_680._8_4_ = fVar125;
    local_680._12_4_ = fVar125;
    local_680._16_4_ = fVar125;
    local_680._20_4_ = fVar125;
    local_680._24_4_ = fVar125;
    local_680._28_4_ = fVar125;
    auVar8 = vfmadd231ps_fma(local_900,local_680,auVar239._0_32_);
    auVar112._8_4_ = 0x3f800000;
    auVar112._0_8_ = 0x3f8000003f800000;
    auVar112._12_4_ = 0x3f800000;
    auVar112._16_4_ = 0x3f800000;
    auVar112._20_4_ = 0x3f800000;
    auVar112._24_4_ = 0x3f800000;
    auVar112._28_4_ = 0x3f800000;
    auVar85 = vsubps_avx(auVar112,ZEXT1632(auVar8));
    fVar96 = auVar8._0_4_;
    fVar122 = auVar8._4_4_;
    auVar52._4_4_ = auVar134._4_4_ * fVar122;
    auVar52._0_4_ = auVar134._0_4_ * fVar96;
    fVar123 = auVar8._8_4_;
    auVar52._8_4_ = auVar134._8_4_ * fVar123;
    fVar124 = auVar8._12_4_;
    auVar52._12_4_ = auVar134._12_4_ * fVar124;
    auVar52._16_4_ = auVar134._16_4_ * 0.0;
    auVar52._20_4_ = auVar134._20_4_ * 0.0;
    uVar66 = local_7c0._28_4_;
    auVar52._24_4_ = auVar134._24_4_ * 0.0;
    auVar52._28_4_ = uVar66;
    auVar242._0_4_ = auVar248._0_4_ * fVar96;
    auVar242._4_4_ = auVar248._4_4_ * fVar122;
    auVar242._8_4_ = auVar248._8_4_ * fVar123;
    auVar242._12_4_ = auVar248._12_4_ * fVar124;
    auVar242._16_4_ = auVar248._16_4_ * 0.0;
    auVar242._20_4_ = auVar248._20_4_ * 0.0;
    auVar242._28_36_ = auVar239._28_36_;
    auVar242._24_4_ = auVar248._24_4_ * 0.0;
    auVar239._0_4_ = auVar241._0_4_ * fVar96;
    auVar239._4_4_ = auVar241._4_4_ * fVar122;
    auVar239._8_4_ = auVar241._8_4_ * fVar123;
    auVar239._12_4_ = auVar241._12_4_ * fVar124;
    auVar239._16_4_ = auVar241._16_4_ * 0.0;
    auVar239._20_4_ = auVar241._20_4_ * 0.0;
    auVar239._28_36_ = auVar225._28_36_;
    auVar239._24_4_ = auVar241._24_4_ * 0.0;
    fVar126 = auVar7._0_4_;
    fVar187 = auVar7._4_4_;
    auVar116._4_4_ = fVar187 * fVar122;
    auVar116._0_4_ = fVar126 * fVar96;
    auVar116._8_4_ = fVar126 * fVar123;
    auVar116._12_4_ = fVar187 * fVar124;
    auVar116._16_4_ = fVar126 * 0.0;
    auVar116._20_4_ = fVar187 * 0.0;
    auVar116._24_4_ = fVar126 * 0.0;
    auVar116._28_4_ = fVar125;
    auVar8 = vfmadd231ps_fma(auVar52,auVar85,auVar178);
    auVar172 = vfmadd231ps_fma(auVar242._0_32_,auVar85,auVar247);
    auVar194 = vfmadd231ps_fma(auVar239._0_32_,auVar85,auVar137);
    auVar78 = vfmadd231ps_fma(auVar116,auVar85,auVar240);
    auVar223._0_4_ = local_360._0_4_ * fVar96;
    auVar223._4_4_ = local_360._4_4_ * fVar122;
    auVar223._8_4_ = local_360._8_4_ * fVar123;
    auVar223._12_4_ = local_360._12_4_ * fVar124;
    auVar223._16_4_ = local_360._16_4_ * 0.0;
    auVar223._20_4_ = local_360._20_4_ * 0.0;
    auVar223._24_4_ = local_360._24_4_ * 0.0;
    auVar223._28_4_ = 0;
    auVar183._4_4_ = fVar122 * fStack_7fc;
    auVar183._0_4_ = fVar96 * local_800;
    auVar183._8_4_ = fVar123 * fStack_7f8;
    auVar183._12_4_ = fVar124 * fStack_7f4;
    auVar183._16_4_ = fStack_7f0 * 0.0;
    auVar183._20_4_ = fStack_7ec * 0.0;
    auVar183._24_4_ = fStack_7e8 * 0.0;
    auVar183._28_4_ = auVar240._28_4_;
    auVar261._4_4_ = local_7c0._4_4_ * fVar122;
    auVar261._0_4_ = local_7c0._0_4_ * fVar96;
    auVar261._8_4_ = local_7c0._8_4_ * fVar123;
    auVar261._12_4_ = local_7c0._12_4_ * fVar124;
    auVar261._16_4_ = local_7c0._16_4_ * 0.0;
    auVar261._20_4_ = local_7c0._20_4_ * 0.0;
    auVar261._24_4_ = local_7c0._24_4_ * 0.0;
    auVar261._28_4_ = local_360._28_4_;
    auVar136._4_4_ = fVar122 * fStack_3dc;
    auVar136._0_4_ = fVar96 * local_3e0;
    auVar136._8_4_ = fVar123 * fStack_3d8;
    auVar136._12_4_ = fVar124 * fStack_3d4;
    auVar136._16_4_ = fStack_3d0 * 0.0;
    auVar136._20_4_ = fStack_3cc * 0.0;
    auVar136._24_4_ = fStack_3c8 * 0.0;
    auVar136._28_4_ = uVar66;
    auVar218 = vfmadd231ps_fma(auVar223,auVar85,auVar134);
    auVar73 = vfmadd231ps_fma(auVar183,auVar85,auVar248);
    auVar72 = vfmadd231ps_fma(auVar261,auVar85,auVar241);
    auVar130 = vfmadd231ps_fma(auVar136,auVar85,auVar260);
    auVar10._4_4_ = fVar122 * fStack_25c;
    auVar10._0_4_ = fVar96 * local_260;
    auVar10._8_4_ = fVar123 * fStack_258;
    auVar10._12_4_ = fVar124 * fStack_254;
    auVar10._16_4_ = fStack_250 * 0.0;
    auVar10._20_4_ = fStack_24c * 0.0;
    auVar10._24_4_ = fStack_248 * 0.0;
    auVar10._28_4_ = auVar247._28_4_;
    auVar11._4_4_ = fVar122 * local_1e0._4_4_;
    auVar11._0_4_ = fVar96 * (float)local_1e0;
    auVar11._8_4_ = fVar123 * (float)uStack_1d8;
    auVar11._12_4_ = fVar124 * uStack_1d8._4_4_;
    auVar11._16_4_ = (float)uStack_1d0 * 0.0;
    auVar11._20_4_ = uStack_1d0._4_4_ * 0.0;
    auVar11._24_4_ = (float)uStack_1c8 * 0.0;
    auVar11._28_4_ = auVar241._28_4_;
    auVar12._28_4_ = uVar66;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(auVar218._12_4_ * fVar124,
                            CONCAT48(auVar218._8_4_ * fVar123,
                                     CONCAT44(auVar218._4_4_ * fVar122,auVar218._0_4_ * fVar96))));
    auVar8 = vfmadd231ps_fma(auVar12,auVar85,ZEXT1632(auVar8));
    auVar53._28_4_ = auVar134._28_4_;
    auVar53._0_28_ =
         ZEXT1628(CONCAT412(fVar124 * auVar73._12_4_,
                            CONCAT48(fVar123 * auVar73._8_4_,
                                     CONCAT44(fVar122 * auVar73._4_4_,fVar96 * auVar73._0_4_))));
    auVar172 = vfmadd231ps_fma(auVar53,auVar85,ZEXT1632(auVar172));
    auVar194 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar72._12_4_,
                                                  CONCAT48(fVar123 * auVar72._8_4_,
                                                           CONCAT44(fVar122 * auVar72._4_4_,
                                                                    fVar96 * auVar72._0_4_)))),
                               auVar85,ZEXT1632(auVar194));
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar130._12_4_,
                                                 CONCAT48(fVar123 * auVar130._8_4_,
                                                          CONCAT44(fVar122 * auVar130._4_4_,
                                                                   fVar96 * auVar130._0_4_)))),
                              auVar85,ZEXT1632(auVar78));
    auVar13._4_4_ = fVar122 * local_200._4_4_;
    auVar13._0_4_ = fVar96 * (float)local_200;
    auVar13._8_4_ = fVar123 * (float)uStack_1f8;
    auVar13._12_4_ = fVar124 * uStack_1f8._4_4_;
    auVar13._16_4_ = (float)uStack_1f0 * 0.0;
    auVar13._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_1e8 * 0.0;
    auVar13._28_4_ = 0;
    auVar98 = vfmadd231ps_fma(auVar10,auVar85,local_360);
    auVar218 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * fVar124,
                                                  CONCAT48(auVar98._8_4_ * fVar123,
                                                           CONCAT44(auVar98._4_4_ * fVar122,
                                                                    auVar98._0_4_ * fVar96)))),
                               auVar85,ZEXT1632(auVar218));
    auVar224._0_4_ = fVar96 * (float)local_220;
    auVar224._4_4_ = fVar122 * local_220._4_4_;
    auVar224._8_4_ = fVar123 * (float)uStack_218;
    auVar224._12_4_ = fVar124 * uStack_218._4_4_;
    auVar224._16_4_ = (float)uStack_210 * 0.0;
    auVar224._20_4_ = uStack_210._4_4_ * 0.0;
    auVar224._24_4_ = (float)uStack_208 * 0.0;
    auVar224._28_4_ = 0;
    auVar55._4_4_ = fStack_7fc;
    auVar55._0_4_ = local_800;
    auVar55._8_4_ = fStack_7f8;
    auVar55._12_4_ = fStack_7f4;
    auVar55._16_4_ = fStack_7f0;
    auVar55._20_4_ = fStack_7ec;
    auVar55._24_4_ = fStack_7e8;
    auVar55._28_4_ = fStack_7e4;
    auVar98 = vfmadd231ps_fma(auVar11,auVar85,auVar55);
    auVar71 = vfmadd231ps_fma(auVar13,auVar85,local_7c0);
    auVar56._4_4_ = fStack_3dc;
    auVar56._0_4_ = local_3e0;
    auVar56._8_4_ = fStack_3d8;
    auVar56._12_4_ = fStack_3d4;
    auVar56._16_4_ = fStack_3d0;
    auVar56._20_4_ = fStack_3cc;
    auVar56._24_4_ = fStack_3c8;
    auVar56._28_4_ = fStack_3c4;
    auVar128 = vfmadd231ps_fma(auVar224,auVar85,auVar56);
    auVar14._28_4_ = uVar66;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(auVar128._12_4_ * fVar124,
                            CONCAT48(auVar128._8_4_ * fVar123,
                                     CONCAT44(auVar128._4_4_ * fVar122,auVar128._0_4_ * fVar96))));
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar98._12_4_ * fVar124,
                                                 CONCAT48(auVar98._8_4_ * fVar123,
                                                          CONCAT44(auVar98._4_4_ * fVar122,
                                                                   auVar98._0_4_ * fVar96)))),
                              auVar85,ZEXT1632(auVar73));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar71._12_4_,
                                                 CONCAT48(fVar123 * auVar71._8_4_,
                                                          CONCAT44(fVar122 * auVar71._4_4_,
                                                                   fVar96 * auVar71._0_4_)))),
                              auVar85,ZEXT1632(auVar72));
    auVar130 = vfmadd231ps_fma(auVar14,auVar85,ZEXT1632(auVar130));
    auVar54._28_4_ = auVar248._28_4_;
    auVar54._0_28_ =
         ZEXT1628(CONCAT412(auVar73._12_4_ * fVar124,
                            CONCAT48(auVar73._8_4_ * fVar123,
                                     CONCAT44(auVar73._4_4_ * fVar122,auVar73._0_4_ * fVar96))));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar218._12_4_ * fVar124,
                                                 CONCAT48(auVar218._8_4_ * fVar123,
                                                          CONCAT44(auVar218._4_4_ * fVar122,
                                                                   auVar218._0_4_ * fVar96)))),
                              auVar85,ZEXT1632(auVar8));
    auVar71 = vfmadd231ps_fma(auVar54,auVar85,ZEXT1632(auVar172));
    auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar124 * auVar72._12_4_,
                                                  CONCAT48(fVar123 * auVar72._8_4_,
                                                           CONCAT44(fVar122 * auVar72._4_4_,
                                                                    fVar96 * auVar72._0_4_)))),
                               auVar85,ZEXT1632(auVar194));
    auVar145 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar124,
                                                  CONCAT48(auVar130._8_4_ * fVar123,
                                                           CONCAT44(auVar130._4_4_ * fVar122,
                                                                    auVar130._0_4_ * fVar96)))),
                               ZEXT1632(auVar78),auVar85);
    auVar240 = vsubps_avx(ZEXT1632(auVar218),ZEXT1632(auVar8));
    auVar85 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar172));
    auVar247 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar194));
    auVar134 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar78));
    fVar187 = fVar127 * auVar240._0_4_ * 3.0;
    fVar201 = fVar127 * auVar240._4_4_ * 3.0;
    local_660._4_4_ = fVar201;
    local_660._0_4_ = fVar187;
    fVar202 = fVar127 * auVar240._8_4_ * 3.0;
    local_660._8_4_ = fVar202;
    fVar203 = fVar127 * auVar240._12_4_ * 3.0;
    local_660._12_4_ = fVar203;
    fVar204 = fVar127 * auVar240._16_4_ * 3.0;
    local_660._16_4_ = fVar204;
    fVar205 = fVar127 * auVar240._20_4_ * 3.0;
    local_660._20_4_ = fVar205;
    fVar206 = fVar127 * auVar240._24_4_ * 3.0;
    local_660._24_4_ = fVar206;
    local_660._28_4_ = 0x40400000;
    local_980._0_4_ = fVar127 * auVar85._0_4_ * 3.0;
    local_980._4_4_ = fVar127 * auVar85._4_4_ * 3.0;
    local_980._8_4_ = fVar127 * auVar85._8_4_ * 3.0;
    local_980._12_4_ = fVar127 * auVar85._12_4_ * 3.0;
    local_980._16_4_ = fVar127 * auVar85._16_4_ * 3.0;
    local_980._20_4_ = fVar127 * auVar85._20_4_ * 3.0;
    local_980._24_4_ = fVar127 * auVar85._24_4_ * 3.0;
    local_980._28_4_ = 0;
    local_a20._0_4_ = fVar127 * auVar247._0_4_ * 3.0;
    local_a20._4_4_ = fVar127 * auVar247._4_4_ * 3.0;
    local_a20._8_4_ = fVar127 * auVar247._8_4_ * 3.0;
    local_a20._12_4_ = fVar127 * auVar247._12_4_ * 3.0;
    local_a20._16_4_ = fVar127 * auVar247._16_4_ * 3.0;
    local_a20._20_4_ = fVar127 * auVar247._20_4_ * 3.0;
    local_a20._24_4_ = fVar127 * auVar247._24_4_ * 3.0;
    local_a20._28_4_ = 0;
    fVar96 = fVar127 * auVar134._0_4_ * 3.0;
    fVar122 = fVar127 * auVar134._4_4_ * 3.0;
    auVar15._4_4_ = fVar122;
    auVar15._0_4_ = fVar96;
    fVar123 = fVar127 * auVar134._8_4_ * 3.0;
    auVar15._8_4_ = fVar123;
    fVar124 = fVar127 * auVar134._12_4_ * 3.0;
    auVar15._12_4_ = fVar124;
    fVar125 = fVar127 * auVar134._16_4_ * 3.0;
    auVar15._16_4_ = fVar125;
    fVar126 = fVar127 * auVar134._20_4_ * 3.0;
    auVar15._20_4_ = fVar126;
    fVar127 = fVar127 * auVar134._24_4_ * 3.0;
    auVar15._24_4_ = fVar127;
    auVar15._28_4_ = auVar240._28_4_;
    auVar178 = ZEXT1632(auVar98);
    local_860 = vpermps_avx2(_DAT_01fb7720,auVar178);
    _local_780 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar71));
    local_960 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar128));
    local_580 = vsubps_avx(local_860,ZEXT1632(auVar98));
    local_560 = vsubps_avx(local_960,ZEXT1632(auVar128));
    local_520 = ZEXT1632(auVar128);
    fVar164 = local_560._0_4_;
    fVar165 = local_560._4_4_;
    auVar16._4_4_ = fVar165 * fVar201;
    auVar16._0_4_ = fVar164 * fVar187;
    fVar187 = local_560._8_4_;
    auVar16._8_4_ = fVar187 * fVar202;
    fVar201 = local_560._12_4_;
    auVar16._12_4_ = fVar201 * fVar203;
    fVar202 = local_560._16_4_;
    auVar16._16_4_ = fVar202 * fVar204;
    fVar203 = local_560._20_4_;
    auVar16._20_4_ = fVar203 * fVar205;
    fVar204 = local_560._24_4_;
    auVar16._24_4_ = fVar204 * fVar206;
    auVar16._28_4_ = local_960._28_4_;
    auVar8 = vfmsub231ps_fma(auVar16,local_a20,local_580);
    local_280 = vsubps_avx(_local_780,ZEXT1632(auVar71));
    fVar252 = local_580._0_4_;
    fVar251 = local_580._4_4_;
    auVar17._4_4_ = fVar251 * local_980._4_4_;
    auVar17._0_4_ = fVar252 * (float)local_980._0_4_;
    fVar253 = local_580._8_4_;
    auVar17._8_4_ = fVar253 * local_980._8_4_;
    fVar254 = local_580._12_4_;
    auVar17._12_4_ = fVar254 * local_980._12_4_;
    fVar255 = local_580._16_4_;
    auVar17._16_4_ = fVar255 * local_980._16_4_;
    fVar256 = local_580._20_4_;
    auVar17._20_4_ = fVar256 * local_980._20_4_;
    fVar257 = local_580._24_4_;
    auVar17._24_4_ = fVar257 * local_980._24_4_;
    auVar17._28_4_ = local_860._28_4_;
    auVar172 = vfmsub231ps_fma(auVar17,local_660,local_280);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar172._12_4_ * auVar172._12_4_,
                                                CONCAT48(auVar172._8_4_ * auVar172._8_4_,
                                                         CONCAT44(auVar172._4_4_ * auVar172._4_4_,
                                                                  auVar172._0_4_ * auVar172._0_4_)))
                                     ),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar135._0_4_ = fVar164 * fVar164;
    auVar135._4_4_ = fVar165 * fVar165;
    auVar135._8_4_ = fVar187 * fVar187;
    auVar135._12_4_ = fVar201 * fVar201;
    auVar135._16_4_ = fVar202 * fVar202;
    auVar135._20_4_ = fVar203 * fVar203;
    auVar135._24_4_ = fVar204 * fVar204;
    auVar135._28_4_ = 0;
    auVar172 = vfmadd231ps_fma(auVar135,local_280,local_280);
    auVar172 = vfmadd231ps_fma(ZEXT1632(auVar172),local_580,local_580);
    fVar205 = local_280._0_4_;
    auVar160._0_4_ = fVar205 * (float)local_a20._0_4_;
    fVar206 = local_280._4_4_;
    auVar160._4_4_ = fVar206 * local_a20._4_4_;
    fVar166 = local_280._8_4_;
    auVar160._8_4_ = fVar166 * local_a20._8_4_;
    fVar167 = local_280._12_4_;
    auVar160._12_4_ = fVar167 * local_a20._12_4_;
    fVar168 = local_280._16_4_;
    auVar160._16_4_ = fVar168 * local_a20._16_4_;
    fVar226 = local_280._20_4_;
    auVar160._20_4_ = fVar226 * local_a20._20_4_;
    fVar246 = local_280._24_4_;
    auVar160._24_4_ = fVar246 * local_a20._24_4_;
    auVar160._28_4_ = 0;
    auVar85 = vrcpps_avx(ZEXT1632(auVar172));
    auVar194 = vfmsub231ps_fma(auVar160,local_980,local_560);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar194),ZEXT1632(auVar194));
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = 0x3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    auVar8 = vfnmadd213ps_fma(auVar85,ZEXT1632(auVar172),auVar243);
    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar85,auVar85);
    local_880 = vpermps_avx2(_DAT_01fb7720,local_660);
    local_9a0 = vpermps_avx2(_DAT_01fb7720,local_a20);
    auVar18._4_4_ = local_880._4_4_ * fVar165;
    auVar18._0_4_ = local_880._0_4_ * fVar164;
    auVar18._8_4_ = local_880._8_4_ * fVar187;
    auVar18._12_4_ = local_880._12_4_ * fVar201;
    auVar18._16_4_ = local_880._16_4_ * fVar202;
    auVar18._20_4_ = local_880._20_4_ * fVar203;
    auVar18._24_4_ = local_880._24_4_ * fVar204;
    auVar18._28_4_ = auVar85._28_4_;
    auVar78 = vfmsub231ps_fma(auVar18,local_9a0,local_580);
    local_7a0 = vpermps_avx2(_DAT_01fb7720,local_980);
    auVar19._4_4_ = fVar251 * local_7a0._4_4_;
    auVar19._0_4_ = fVar252 * local_7a0._0_4_;
    auVar19._8_4_ = fVar253 * local_7a0._8_4_;
    auVar19._12_4_ = fVar254 * local_7a0._12_4_;
    auVar19._16_4_ = fVar255 * local_7a0._16_4_;
    auVar19._20_4_ = fVar256 * local_7a0._20_4_;
    auVar19._24_4_ = fVar257 * local_7a0._24_4_;
    auVar19._28_4_ = 0x40400000;
    auVar218 = vfmsub231ps_fma(auVar19,local_880,local_280);
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar218._12_4_ * auVar218._12_4_,
                                                 CONCAT48(auVar218._8_4_ * auVar218._8_4_,
                                                          CONCAT44(auVar218._4_4_ * auVar218._4_4_,
                                                                   auVar218._0_4_ * auVar218._0_4_))
                                                )),ZEXT1632(auVar78),ZEXT1632(auVar78));
    auVar241 = local_9a0;
    auVar179._0_4_ = fVar205 * local_9a0._0_4_;
    auVar179._4_4_ = fVar206 * local_9a0._4_4_;
    auVar179._8_4_ = fVar166 * local_9a0._8_4_;
    auVar179._12_4_ = fVar167 * local_9a0._12_4_;
    auVar179._16_4_ = fVar168 * local_9a0._16_4_;
    auVar179._20_4_ = fVar226 * local_9a0._20_4_;
    auVar179._24_4_ = fVar246 * local_9a0._24_4_;
    auVar179._28_4_ = 0;
    auVar111 = local_7a0;
    auVar218 = vfmsub231ps_fma(auVar179,local_7a0,local_560);
    auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),ZEXT1632(auVar218),ZEXT1632(auVar218));
    auVar85 = vmaxps_avx(ZEXT1632(CONCAT412(auVar194._12_4_ * auVar8._12_4_,
                                            CONCAT48(auVar194._8_4_ * auVar8._8_4_,
                                                     CONCAT44(auVar194._4_4_ * auVar8._4_4_,
                                                              auVar194._0_4_ * auVar8._0_4_)))),
                         ZEXT1632(CONCAT412(auVar78._12_4_ * auVar8._12_4_,
                                            CONCAT48(auVar78._8_4_ * auVar8._8_4_,
                                                     CONCAT44(auVar78._4_4_ * auVar8._4_4_,
                                                              auVar78._0_4_ * auVar8._0_4_)))));
    local_6c0._0_4_ = auVar145._0_4_ + fVar96;
    local_6c0._4_4_ = auVar145._4_4_ + fVar122;
    local_6c0._8_4_ = auVar145._8_4_ + fVar123;
    local_6c0._12_4_ = auVar145._12_4_ + fVar124;
    local_6c0._16_4_ = fVar125 + 0.0;
    local_6c0._20_4_ = fVar126 + 0.0;
    local_6c0._24_4_ = fVar127 + 0.0;
    local_6c0._28_4_ = auVar240._28_4_ + 0.0;
    local_6a0 = ZEXT1632(auVar145);
    auVar240 = vsubps_avx(local_6a0,auVar15);
    local_6e0 = vpermps_avx2(_DAT_01fb7720,auVar240);
    local_820 = vpermps_avx2(_DAT_01fb7720,local_6a0);
    auVar240 = vmaxps_avx(local_6a0,local_6c0);
    auVar134 = vrsqrtps_avx(ZEXT1632(auVar172));
    auVar247 = vmaxps_avx(local_6e0,local_820);
    auVar240 = vmaxps_avx(auVar240,auVar247);
    fVar96 = auVar134._0_4_;
    fVar122 = auVar134._4_4_;
    fVar123 = auVar134._8_4_;
    fVar124 = auVar134._12_4_;
    fVar127 = auVar134._16_4_;
    fVar125 = auVar134._20_4_;
    fVar126 = auVar134._24_4_;
    auVar59._4_4_ = fVar122 * fVar122 * fVar122 * auVar172._4_4_ * -0.5;
    auVar59._0_4_ = fVar96 * fVar96 * fVar96 * auVar172._0_4_ * -0.5;
    auVar59._8_4_ = fVar123 * fVar123 * fVar123 * auVar172._8_4_ * -0.5;
    auVar59._12_4_ = fVar124 * fVar124 * fVar124 * auVar172._12_4_ * -0.5;
    auVar59._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
    auVar59._20_4_ = fVar125 * fVar125 * fVar125 * -0.0;
    auVar59._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
    auVar59._28_4_ = DAT_01fb7720._28_4_;
    auVar86._8_4_ = 0x3fc00000;
    auVar86._0_8_ = 0x3fc000003fc00000;
    auVar86._12_4_ = 0x3fc00000;
    auVar86._16_4_ = 0x3fc00000;
    auVar86._20_4_ = 0x3fc00000;
    auVar86._24_4_ = 0x3fc00000;
    auVar86._28_4_ = 0x3fc00000;
    auVar8 = vfmadd231ps_fma(auVar59,auVar86,auVar134);
    fVar122 = auVar8._0_4_;
    fVar123 = auVar8._4_4_;
    auVar20._4_4_ = fVar206 * fVar123;
    auVar20._0_4_ = fVar205 * fVar122;
    fVar127 = auVar8._8_4_;
    auVar20._8_4_ = fVar166 * fVar127;
    fVar126 = auVar8._12_4_;
    auVar20._12_4_ = fVar167 * fVar126;
    auVar20._16_4_ = fVar168 * 0.0;
    auVar20._20_4_ = fVar226 * 0.0;
    auVar20._24_4_ = fVar246 * 0.0;
    auVar20._28_4_ = 0x3fc00000;
    auVar21._4_4_ = fStack_61c * fVar165 * fVar123;
    auVar21._0_4_ = local_620 * fVar164 * fVar122;
    auVar21._8_4_ = fStack_618 * fVar187 * fVar127;
    auVar21._12_4_ = fStack_614 * fVar201 * fVar126;
    auVar21._16_4_ = fStack_610 * fVar202 * 0.0;
    auVar21._20_4_ = fStack_60c * fVar203 * 0.0;
    auVar21._24_4_ = fStack_608 * fVar204 * 0.0;
    auVar21._28_4_ = local_820._28_4_;
    auVar172 = vfmadd231ps_fma(auVar21,auVar20,_local_4e0);
    auVar247 = vsubps_avx(ZEXT832(0) << 0x20,local_520);
    fVar205 = auVar247._0_4_;
    fVar206 = auVar247._4_4_;
    auVar22._4_4_ = fVar206 * fVar165 * fVar123;
    auVar22._0_4_ = fVar205 * fVar164 * fVar122;
    fVar164 = auVar247._8_4_;
    auVar22._8_4_ = fVar164 * fVar187 * fVar127;
    fVar165 = auVar247._12_4_;
    auVar22._12_4_ = fVar165 * fVar201 * fVar126;
    fVar166 = auVar247._16_4_;
    auVar22._16_4_ = fVar166 * fVar202 * 0.0;
    fVar167 = auVar247._20_4_;
    auVar22._20_4_ = fVar167 * fVar203 * 0.0;
    fVar168 = auVar247._24_4_;
    auVar22._24_4_ = fVar168 * fVar204 * 0.0;
    auVar22._28_4_ = local_560._28_4_;
    local_540 = ZEXT1632(auVar71);
    auVar134 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    auVar194 = vfmadd231ps_fma(auVar22,auVar134,auVar20);
    local_7e0 = ZEXT1632(auVar8);
    auVar23._4_4_ = fVar251 * fVar123;
    auVar23._0_4_ = fVar252 * fVar122;
    auVar23._8_4_ = fVar253 * fVar127;
    auVar23._12_4_ = fVar254 * fVar126;
    auVar23._16_4_ = fVar255 * 0.0;
    auVar23._20_4_ = fVar256 * 0.0;
    auVar23._24_4_ = fVar257 * 0.0;
    auVar23._28_4_ = 0x3fc00000;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar172),auVar23,_local_500);
    auVar183 = ZEXT832(0) << 0x20;
    auVar248 = vsubps_avx(auVar183,auVar178);
    auVar172 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar248,auVar23);
    auVar24._4_4_ = fStack_61c * fVar206;
    auVar24._0_4_ = local_620 * fVar205;
    auVar24._8_4_ = fStack_618 * fVar164;
    auVar24._12_4_ = fStack_614 * fVar165;
    auVar24._16_4_ = fStack_610 * fVar166;
    auVar24._20_4_ = fStack_60c * fVar167;
    auVar24._24_4_ = fStack_608 * fVar168;
    auVar24._28_4_ = 0x3fc00000;
    auVar194 = vfmadd231ps_fma(auVar24,_local_4e0,auVar134);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),_local_500,auVar248);
    fVar96 = auVar172._0_4_;
    fVar226 = auVar8._0_4_;
    fVar124 = auVar172._4_4_;
    fVar251 = auVar8._4_4_;
    fVar125 = auVar172._8_4_;
    fVar253 = auVar8._8_4_;
    fVar187 = auVar172._12_4_;
    fVar254 = auVar8._12_4_;
    uVar66 = local_4e0._28_4_;
    auVar25._28_4_ = uVar66;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar187,
                            CONCAT48(fVar253 * fVar125,CONCAT44(fVar251 * fVar124,fVar226 * fVar96))
                           ));
    auVar137 = vsubps_avx(ZEXT1632(auVar194),auVar25);
    auVar26._4_4_ = fVar206 * fVar206;
    auVar26._0_4_ = fVar205 * fVar205;
    auVar26._8_4_ = fVar164 * fVar164;
    auVar26._12_4_ = fVar165 * fVar165;
    auVar26._16_4_ = fVar166 * fVar166;
    auVar26._20_4_ = fVar167 * fVar167;
    auVar26._24_4_ = fVar168 * fVar168;
    auVar26._28_4_ = uVar66;
    auVar194 = vfmadd231ps_fma(auVar26,auVar134,auVar134);
    auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar248,auVar248);
    auVar27._28_4_ = local_500._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar187 * fVar187,
                            CONCAT48(fVar125 * fVar125,CONCAT44(fVar124 * fVar124,fVar96 * fVar96)))
                 );
    _local_700 = vsubps_avx(ZEXT1632(auVar194),auVar27);
    _local_740 = vsqrtps_avx(auVar85);
    fVar204 = local_740._28_4_ + auVar240._28_4_;
    fVar96 = (local_740._0_4_ + auVar240._0_4_) * 1.0000002;
    fVar124 = (local_740._4_4_ + auVar240._4_4_) * 1.0000002;
    fVar125 = (local_740._8_4_ + auVar240._8_4_) * 1.0000002;
    fVar187 = (local_740._12_4_ + auVar240._12_4_) * 1.0000002;
    fVar201 = (local_740._16_4_ + auVar240._16_4_) * 1.0000002;
    fVar202 = (local_740._20_4_ + auVar240._20_4_) * 1.0000002;
    fVar203 = (local_740._24_4_ + auVar240._24_4_) * 1.0000002;
    auVar28._4_4_ = fVar124 * fVar124;
    auVar28._0_4_ = fVar96 * fVar96;
    auVar28._8_4_ = fVar125 * fVar125;
    auVar28._12_4_ = fVar187 * fVar187;
    auVar28._16_4_ = fVar201 * fVar201;
    auVar28._20_4_ = fVar202 * fVar202;
    auVar28._24_4_ = fVar203 * fVar203;
    auVar28._28_4_ = fVar204;
    fVar246 = auVar137._0_4_ + auVar137._0_4_;
    fVar252 = auVar137._4_4_ + auVar137._4_4_;
    local_2c0._0_8_ = CONCAT44(fVar252,fVar246);
    local_2c0._8_4_ = auVar137._8_4_ + auVar137._8_4_;
    local_2c0._12_4_ = auVar137._12_4_ + auVar137._12_4_;
    local_2c0._16_4_ = auVar137._16_4_ + auVar137._16_4_;
    local_2c0._20_4_ = auVar137._20_4_ + auVar137._20_4_;
    local_2c0._24_4_ = auVar137._24_4_ + auVar137._24_4_;
    local_2c0._28_4_ = auVar137._28_4_ + auVar137._28_4_;
    local_5c0 = vsubps_avx(_local_700,auVar28);
    auVar261 = ZEXT1632(auVar8);
    local_2a0._28_4_ = local_880._28_4_;
    local_2a0._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar254,
                            CONCAT48(fVar253 * fVar253,CONCAT44(fVar251 * fVar251,fVar226 * fVar226)
                                    )));
    auVar240 = vsubps_avx(local_240,local_2a0);
    local_720._4_4_ = fVar252 * fVar252;
    local_720._0_4_ = fVar246 * fVar246;
    local_720._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    local_720._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    local_720._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    local_720._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    local_720._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    local_720._28_4_ = fVar204;
    fVar96 = auVar240._0_4_;
    fVar124 = fVar96 * 4.0;
    fVar187 = auVar240._4_4_;
    fVar125 = fVar187 * 4.0;
    fVar201 = auVar240._8_4_;
    fStack_838 = fVar201 * 4.0;
    fVar202 = auVar240._12_4_;
    fStack_834 = fVar202 * 4.0;
    fVar203 = auVar240._16_4_;
    fStack_830 = fVar203 * 4.0;
    fVar204 = auVar240._20_4_;
    fStack_82c = fVar204 * 4.0;
    fVar226 = auVar240._24_4_;
    fStack_828 = fVar226 * 4.0;
    local_840 = CONCAT44(fVar125,fVar124);
    uStack_824 = 0x40800000;
    auVar29._4_4_ = fVar125 * local_5c0._4_4_;
    auVar29._0_4_ = fVar124 * local_5c0._0_4_;
    auVar29._8_4_ = fStack_838 * local_5c0._8_4_;
    auVar29._12_4_ = fStack_834 * local_5c0._12_4_;
    auVar29._16_4_ = fStack_830 * local_5c0._16_4_;
    auVar29._20_4_ = fStack_82c * local_5c0._20_4_;
    auVar29._24_4_ = fStack_828 * local_5c0._24_4_;
    auVar29._28_4_ = 0x40800000;
    auVar137 = vsubps_avx(local_720,auVar29);
    auVar85 = vcmpps_avx(auVar137,auVar183,5);
    local_2e0._0_4_ = fVar96 + fVar96;
    local_2e0._4_4_ = fVar187 + fVar187;
    local_2e0._8_4_ = fVar201 + fVar201;
    local_2e0._12_4_ = fVar202 + fVar202;
    local_2e0._16_4_ = fVar203 + fVar203;
    local_2e0._20_4_ = fVar204 + fVar204;
    local_2e0._24_4_ = fVar226 + fVar226;
    fVar96 = auVar240._28_4_;
    local_2e0._28_4_ = fVar96 + fVar96;
    auVar116 = ZEXT1632(auVar172);
    if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0x7f,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar85 >> 0xbf,0) == '\0') &&
        (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f]) {
      auVar113._8_4_ = 0x7f800000;
      auVar113._0_8_ = 0x7f8000007f800000;
      auVar113._12_4_ = 0x7f800000;
      auVar113._16_4_ = 0x7f800000;
      auVar113._20_4_ = 0x7f800000;
      auVar113._24_4_ = 0x7f800000;
      auVar113._28_4_ = 0x7f800000;
      auVar262._8_4_ = 0xff800000;
      auVar262._0_8_ = 0xff800000ff800000;
      auVar262._12_4_ = 0xff800000;
      auVar262._16_4_ = 0xff800000;
      auVar262._20_4_ = 0xff800000;
      auVar262._24_4_ = 0xff800000;
      auVar262._28_4_ = 0xff800000;
    }
    else {
      auVar136 = vsqrtps_avx(auVar137);
      local_5a0 = vcmpps_avx(auVar137,auVar183,5);
      auVar137 = vrcpps_avx(local_2e0);
      auVar234._8_4_ = 0x3f800000;
      auVar234._0_8_ = 0x3f8000003f800000;
      auVar234._12_4_ = 0x3f800000;
      auVar234._16_4_ = 0x3f800000;
      auVar234._20_4_ = 0x3f800000;
      auVar234._24_4_ = 0x3f800000;
      auVar234._28_4_ = 0x3f800000;
      auVar8 = vfnmadd213ps_fma(auVar137,local_2e0,auVar234);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar137,auVar137);
      auVar210._0_8_ = local_2c0._0_8_ ^ 0x8000000080000000;
      auVar210._8_4_ = -local_2c0._8_4_;
      auVar210._12_4_ = -local_2c0._12_4_;
      auVar210._16_4_ = -local_2c0._16_4_;
      auVar210._20_4_ = -local_2c0._20_4_;
      auVar210._24_4_ = -local_2c0._24_4_;
      auVar210._28_4_ = -local_2c0._28_4_;
      auVar137 = vsubps_avx(auVar210,auVar136);
      auVar30._4_4_ = auVar8._4_4_ * auVar137._4_4_;
      auVar30._0_4_ = auVar8._0_4_ * auVar137._0_4_;
      auVar30._8_4_ = auVar8._8_4_ * auVar137._8_4_;
      auVar30._12_4_ = auVar8._12_4_ * auVar137._12_4_;
      auVar30._16_4_ = auVar137._16_4_ * 0.0;
      auVar30._20_4_ = auVar137._20_4_ * 0.0;
      auVar30._24_4_ = auVar137._24_4_ * 0.0;
      auVar30._28_4_ = local_2c0._28_4_;
      auVar137 = vsubps_avx(auVar136,local_2c0);
      auVar263._0_4_ = auVar8._0_4_ * auVar137._0_4_;
      auVar263._4_4_ = auVar8._4_4_ * auVar137._4_4_;
      auVar263._8_4_ = auVar8._8_4_ * auVar137._8_4_;
      auVar263._12_4_ = auVar8._12_4_ * auVar137._12_4_;
      auVar263._16_4_ = auVar137._16_4_ * 0.0;
      auVar263._20_4_ = auVar137._20_4_ * 0.0;
      auVar263._24_4_ = auVar137._24_4_ * 0.0;
      auVar263._28_4_ = 0;
      auVar8 = vfmadd213ps_fma(auVar261,auVar30,auVar116);
      local_380 = fVar122 * auVar8._0_4_;
      fStack_37c = fVar123 * auVar8._4_4_;
      fStack_378 = fVar127 * auVar8._8_4_;
      fStack_374 = fVar126 * auVar8._12_4_;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      fStack_364 = fVar96;
      auVar137 = vandps_avx(local_2a0,local_640);
      auVar137 = vmaxps_avx(local_420,auVar137);
      auVar31._4_4_ = auVar137._4_4_ * 1.9073486e-06;
      auVar31._0_4_ = auVar137._0_4_ * 1.9073486e-06;
      auVar31._8_4_ = auVar137._8_4_ * 1.9073486e-06;
      auVar31._12_4_ = auVar137._12_4_ * 1.9073486e-06;
      auVar31._16_4_ = auVar137._16_4_ * 1.9073486e-06;
      auVar31._20_4_ = auVar137._20_4_ * 1.9073486e-06;
      auVar31._24_4_ = auVar137._24_4_ * 1.9073486e-06;
      auVar31._28_4_ = auVar137._28_4_;
      auVar137 = vandps_avx(auVar240,local_640);
      auVar137 = vcmpps_avx(auVar137,auVar31,1);
      auVar8 = vfmadd213ps_fma(auVar261,auVar263,auVar116);
      auVar114._8_4_ = 0x7f800000;
      auVar114._0_8_ = 0x7f8000007f800000;
      auVar114._12_4_ = 0x7f800000;
      auVar114._16_4_ = 0x7f800000;
      auVar114._20_4_ = 0x7f800000;
      auVar114._24_4_ = 0x7f800000;
      auVar114._28_4_ = 0x7f800000;
      auVar113 = vblendvps_avx(auVar114,auVar30,local_5a0);
      local_3a0 = auVar8._0_4_ * fVar122;
      fStack_39c = auVar8._4_4_ * fVar123;
      fStack_398 = auVar8._8_4_ * fVar127;
      fStack_394 = auVar8._12_4_ * fVar126;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      fStack_384 = fVar96;
      auVar235._8_4_ = 0xff800000;
      auVar235._0_8_ = 0xff800000ff800000;
      auVar235._12_4_ = 0xff800000;
      auVar235._16_4_ = 0xff800000;
      auVar235._20_4_ = 0xff800000;
      auVar235._24_4_ = 0xff800000;
      auVar235._28_4_ = 0xff800000;
      auVar262 = vblendvps_avx(auVar235,auVar263,local_5a0);
      auVar183 = local_5a0 & auVar137;
      if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar183 >> 0x7f,0) != '\0') ||
            (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar183 >> 0xbf,0) != '\0') ||
          (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar183[0x1f] < '\0') {
        auVar85 = vandps_avx(local_5a0,auVar137);
        auVar183 = vcmpps_avx(local_5c0,_DAT_01f7b000,2);
        auVar95._8_4_ = 0xff800000;
        auVar95._0_8_ = 0xff800000ff800000;
        auVar95._12_4_ = 0xff800000;
        auVar95._16_4_ = 0xff800000;
        auVar95._20_4_ = 0xff800000;
        auVar95._24_4_ = 0xff800000;
        auVar95._28_4_ = 0xff800000;
        auVar249._8_4_ = 0x7f800000;
        auVar249._0_8_ = 0x7f8000007f800000;
        auVar249._12_4_ = 0x7f800000;
        auVar249._16_4_ = 0x7f800000;
        auVar249._20_4_ = 0x7f800000;
        auVar249._24_4_ = 0x7f800000;
        auVar249._28_4_ = 0x7f800000;
        auVar137 = vblendvps_avx(auVar249,auVar95,auVar183);
        auVar8 = vpackssdw_avx(auVar85._0_16_,auVar85._16_16_);
        auVar136 = vpmovsxwd_avx2(auVar8);
        auVar113 = vblendvps_avx(auVar113,auVar137,auVar136);
        auVar137 = vblendvps_avx(auVar95,auVar249,auVar183);
        auVar262 = vblendvps_avx(auVar262,auVar137,auVar136);
        auVar215._0_8_ = auVar85._0_8_ ^ 0xffffffffffffffff;
        auVar215._8_4_ = auVar85._8_4_ ^ 0xffffffff;
        auVar215._12_4_ = auVar85._12_4_ ^ 0xffffffff;
        auVar215._16_4_ = auVar85._16_4_ ^ 0xffffffff;
        auVar215._20_4_ = auVar85._20_4_ ^ 0xffffffff;
        auVar215._24_4_ = auVar85._24_4_ ^ 0xffffffff;
        auVar215._28_4_ = auVar85._28_4_ ^ 0xffffffff;
        auVar85 = vorps_avx(auVar183,auVar215);
        auVar85 = vandps_avx(local_5a0,auVar85);
      }
    }
    auVar137 = local_300 & auVar85;
    if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar137 >> 0x7f,0) == '\0') &&
          (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar137 >> 0xbf,0) == '\0') &&
        (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar137[0x1f])
    {
LAB_0113a6d8:
      auVar225 = ZEXT3264(local_a40);
      local_840 = uVar64;
      auVar241 = local_8c0;
      auVar134 = local_8e0;
      auVar248 = local_8a0;
    }
    else {
      local_5c0 = auVar240;
      local_5a0 = auVar85;
      fVar96 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_760._0_4_;
      auVar87._4_4_ = fVar96;
      auVar87._0_4_ = fVar96;
      auVar87._8_4_ = fVar96;
      auVar87._12_4_ = fVar96;
      auVar87._16_4_ = fVar96;
      auVar87._20_4_ = fVar96;
      auVar87._24_4_ = fVar96;
      auVar87._28_4_ = fVar96;
      auVar137 = vmaxps_avx(auVar87,auVar113);
      fVar96 = (ray->super_RayK<1>).tfar - (float)local_760._0_4_;
      auVar115._4_4_ = fVar96;
      auVar115._0_4_ = fVar96;
      auVar115._8_4_ = fVar96;
      auVar115._12_4_ = fVar96;
      auVar115._16_4_ = fVar96;
      auVar115._20_4_ = fVar96;
      auVar115._24_4_ = fVar96;
      auVar115._28_4_ = fVar96;
      auVar183 = vminps_avx(auVar115,auVar262);
      auVar32._4_4_ = local_a20._4_4_ * fVar206;
      auVar32._0_4_ = (float)local_a20._0_4_ * fVar205;
      auVar32._8_4_ = local_a20._8_4_ * fVar164;
      auVar32._12_4_ = local_a20._12_4_ * fVar165;
      auVar32._16_4_ = local_a20._16_4_ * fVar166;
      auVar32._20_4_ = local_a20._20_4_ * fVar167;
      auVar32._24_4_ = local_a20._24_4_ * fVar168;
      auVar32._28_4_ = fVar96;
      auVar8 = vfmadd213ps_fma(auVar134,local_980,auVar32);
      auVar172 = vfmadd213ps_fma(auVar248,local_660,ZEXT1632(auVar8));
      auVar33._4_4_ = local_a20._4_4_ * fStack_61c;
      auVar33._0_4_ = (float)local_a20._0_4_ * local_620;
      auVar33._8_4_ = local_a20._8_4_ * fStack_618;
      auVar33._12_4_ = local_a20._12_4_ * fStack_614;
      auVar33._16_4_ = local_a20._16_4_ * fStack_610;
      auVar33._20_4_ = local_a20._20_4_ * fStack_60c;
      auVar33._24_4_ = local_a20._24_4_ * fStack_608;
      auVar33._28_4_ = auVar247._28_4_;
      auVar8 = vfmadd231ps_fma(auVar33,_local_4e0,local_980);
      auVar194 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_500,local_660);
      auVar247 = vandps_avx(local_640,ZEXT1632(auVar194));
      auVar180._8_4_ = 0x219392ef;
      auVar180._0_8_ = 0x219392ef219392ef;
      auVar180._12_4_ = 0x219392ef;
      auVar180._16_4_ = 0x219392ef;
      auVar180._20_4_ = 0x219392ef;
      auVar180._24_4_ = 0x219392ef;
      auVar180._28_4_ = 0x219392ef;
      auVar134 = vcmpps_avx(auVar247,auVar180,1);
      auVar247 = vrcpps_avx(ZEXT1632(auVar194));
      auVar264._8_4_ = 0x3f800000;
      auVar264._0_8_ = 0x3f8000003f800000;
      auVar264._12_4_ = 0x3f800000;
      auVar264._16_4_ = 0x3f800000;
      auVar264._20_4_ = 0x3f800000;
      auVar264._24_4_ = 0x3f800000;
      auVar264._28_4_ = 0x3f800000;
      auVar136 = ZEXT1632(auVar194);
      auVar8 = vfnmadd213ps_fma(auVar247,auVar136,auVar264);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar247,auVar247);
      auVar236._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
      auVar236._8_4_ = auVar194._8_4_ ^ 0x80000000;
      auVar236._12_4_ = auVar194._12_4_ ^ 0x80000000;
      auVar236._16_4_ = 0x80000000;
      auVar236._20_4_ = 0x80000000;
      auVar236._24_4_ = 0x80000000;
      auVar236._28_4_ = 0x80000000;
      auVar34._4_4_ = auVar8._4_4_ * -auVar172._4_4_;
      auVar34._0_4_ = auVar8._0_4_ * -auVar172._0_4_;
      auVar34._8_4_ = auVar8._8_4_ * -auVar172._8_4_;
      auVar34._12_4_ = auVar8._12_4_ * -auVar172._12_4_;
      auVar34._16_4_ = 0x80000000;
      auVar34._20_4_ = 0x80000000;
      auVar34._24_4_ = 0x80000000;
      auVar34._28_4_ = 0x80000000;
      auVar247 = vcmpps_avx(auVar136,auVar236,1);
      auVar247 = vorps_avx(auVar134,auVar247);
      auVar244._8_4_ = 0xff800000;
      auVar244._0_8_ = 0xff800000ff800000;
      auVar244._12_4_ = 0xff800000;
      auVar244._16_4_ = 0xff800000;
      auVar244._20_4_ = 0xff800000;
      auVar244._24_4_ = 0xff800000;
      auVar244._28_4_ = 0xff800000;
      auVar247 = vblendvps_avx(auVar34,auVar244,auVar247);
      auVar248 = vmaxps_avx(auVar137,auVar247);
      auVar247 = vcmpps_avx(auVar136,auVar236,6);
      auVar247 = vorps_avx(auVar134,auVar247);
      auVar237._8_4_ = 0x7f800000;
      auVar237._0_8_ = 0x7f8000007f800000;
      auVar237._12_4_ = 0x7f800000;
      auVar237._16_4_ = 0x7f800000;
      auVar237._20_4_ = 0x7f800000;
      auVar237._24_4_ = 0x7f800000;
      auVar237._28_4_ = 0x7f800000;
      auVar247 = vblendvps_avx(auVar34,auVar237,auVar247);
      auVar137 = vminps_avx(auVar183,auVar247);
      fVar96 = -local_9a0._0_4_;
      fVar187 = -local_9a0._4_4_;
      fVar201 = -local_9a0._8_4_;
      fVar202 = -local_9a0._12_4_;
      fVar203 = -local_9a0._16_4_;
      fVar204 = -local_9a0._20_4_;
      fVar205 = -local_9a0._24_4_;
      auVar161._0_8_ = local_7a0._0_8_ ^ 0x8000000080000000;
      auVar161._8_4_ = -local_7a0._8_4_;
      auVar161._12_4_ = -local_7a0._12_4_;
      auVar161._16_4_ = -local_7a0._16_4_;
      auVar161._20_4_ = -local_7a0._20_4_;
      auVar161._24_4_ = -local_7a0._24_4_;
      auVar161._28_4_ = local_7a0._28_4_ ^ 0x80000000;
      auVar247 = vsubps_avx(ZEXT832(0) << 0x20,_local_780);
      auVar134 = vsubps_avx(ZEXT832(0) << 0x20,local_960);
      auVar35._4_4_ = auVar134._4_4_ * fVar187;
      auVar35._0_4_ = auVar134._0_4_ * fVar96;
      auVar35._8_4_ = auVar134._8_4_ * fVar201;
      auVar35._12_4_ = auVar134._12_4_ * fVar202;
      auVar35._16_4_ = auVar134._16_4_ * fVar203;
      auVar35._20_4_ = auVar134._20_4_ * fVar204;
      auVar35._24_4_ = auVar134._24_4_ * fVar205;
      auVar35._28_4_ = auVar134._28_4_;
      auVar8 = vfmadd231ps_fma(auVar35,auVar161,auVar247);
      auVar181._0_8_ = local_880._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = -local_880._8_4_;
      auVar181._12_4_ = -local_880._12_4_;
      auVar181._16_4_ = -local_880._16_4_;
      auVar181._20_4_ = -local_880._20_4_;
      auVar181._24_4_ = -local_880._24_4_;
      auVar181._28_4_ = local_880._28_4_ ^ 0x80000000;
      auVar247 = vsubps_avx(ZEXT832(0) << 0x20,local_860);
      auVar172 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar181,auVar247);
      auVar36._4_4_ = fVar187 * fStack_61c;
      auVar36._0_4_ = fVar96 * local_620;
      auVar36._8_4_ = fVar201 * fStack_618;
      auVar36._12_4_ = fVar202 * fStack_614;
      auVar36._16_4_ = fVar203 * fStack_610;
      auVar36._20_4_ = fVar204 * fStack_60c;
      auVar36._24_4_ = fVar205 * fStack_608;
      auVar36._28_4_ = local_9a0._28_4_ ^ 0x80000000;
      auVar8 = vfmadd231ps_fma(auVar36,_local_4e0,auVar161);
      auVar194 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_500,auVar181);
      auVar247 = vandps_avx(local_640,ZEXT1632(auVar194));
      auVar183 = vrcpps_avx(ZEXT1632(auVar194));
      auVar211._8_4_ = 0x219392ef;
      auVar211._0_8_ = 0x219392ef219392ef;
      auVar211._12_4_ = 0x219392ef;
      auVar211._16_4_ = 0x219392ef;
      auVar211._20_4_ = 0x219392ef;
      auVar211._24_4_ = 0x219392ef;
      auVar211._28_4_ = 0x219392ef;
      auVar134 = vcmpps_avx(auVar247,auVar211,1);
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = 0x3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      auVar232._16_4_ = 0x3f800000;
      auVar232._20_4_ = 0x3f800000;
      auVar232._24_4_ = 0x3f800000;
      auVar232._28_4_ = 0x3f800000;
      auVar136 = ZEXT1632(auVar194);
      auVar8 = vfnmadd213ps_fma(auVar183,auVar136,auVar232);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar183,auVar183);
      auVar182._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
      auVar182._8_4_ = auVar194._8_4_ ^ 0x80000000;
      auVar182._12_4_ = auVar194._12_4_ ^ 0x80000000;
      auVar182._16_4_ = 0x80000000;
      auVar182._20_4_ = 0x80000000;
      auVar182._24_4_ = 0x80000000;
      auVar182._28_4_ = 0x80000000;
      auVar37._4_4_ = auVar8._4_4_ * -auVar172._4_4_;
      auVar37._0_4_ = auVar8._0_4_ * -auVar172._0_4_;
      auVar37._8_4_ = auVar8._8_4_ * -auVar172._8_4_;
      auVar37._12_4_ = auVar8._12_4_ * -auVar172._12_4_;
      auVar37._16_4_ = 0x80000000;
      auVar37._20_4_ = 0x80000000;
      auVar37._24_4_ = 0x80000000;
      auVar37._28_4_ = 0x80000000;
      auVar247 = vcmpps_avx(auVar136,auVar182,1);
      auVar247 = vorps_avx(auVar134,auVar247);
      auVar247 = vblendvps_avx(auVar37,auVar244,auVar247);
      local_460 = vmaxps_avx(auVar248,auVar247);
      auVar247 = vcmpps_avx(auVar136,auVar182,6);
      auVar247 = vorps_avx(auVar134,auVar247);
      auVar247 = vblendvps_avx(auVar37,auVar237,auVar247);
      auVar85 = vandps_avx(local_300,auVar85);
      local_480 = vminps_avx(auVar137,auVar247);
      auVar247 = vcmpps_avx(local_460,local_480,2);
      auVar134 = auVar85 & auVar247;
      if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0x7f,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar134 >> 0xbf,0) == '\0') &&
          (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar134[0x1f]) goto LAB_0113a6d8;
      auVar58._4_4_ = fStack_37c;
      auVar58._0_4_ = local_380;
      auVar58._8_4_ = fStack_378;
      auVar58._12_4_ = fStack_374;
      auVar58._16_4_ = uStack_370;
      auVar58._20_4_ = uStack_36c;
      auVar58._24_4_ = uStack_368;
      auVar58._28_4_ = fStack_364;
      auVar212._8_4_ = 0x3f800000;
      auVar212._0_8_ = 0x3f8000003f800000;
      auVar212._12_4_ = 0x3f800000;
      auVar212._16_4_ = 0x3f800000;
      auVar212._20_4_ = 0x3f800000;
      auVar212._24_4_ = 0x3f800000;
      auVar212._28_4_ = 0x3f800000;
      auVar134 = vminps_avx(auVar58,auVar212);
      auVar137 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar134 = vmaxps_avx(auVar134,ZEXT832(0) << 0x20);
      auVar57._4_4_ = fStack_39c;
      auVar57._0_4_ = local_3a0;
      auVar57._8_4_ = fStack_398;
      auVar57._12_4_ = fStack_394;
      auVar57._16_4_ = uStack_390;
      auVar57._20_4_ = uStack_38c;
      auVar57._24_4_ = uStack_388;
      auVar57._28_4_ = fStack_384;
      auVar248 = vminps_avx(auVar57,auVar212);
      auVar248 = vmaxps_avx(auVar248,ZEXT832(0) << 0x20);
      auVar38._4_4_ = (auVar134._4_4_ + 1.0) * 0.125;
      auVar38._0_4_ = (auVar134._0_4_ + 0.0) * 0.125;
      auVar38._8_4_ = (auVar134._8_4_ + 2.0) * 0.125;
      auVar38._12_4_ = (auVar134._12_4_ + 3.0) * 0.125;
      auVar38._16_4_ = (auVar134._16_4_ + 4.0) * 0.125;
      auVar38._20_4_ = (auVar134._20_4_ + 5.0) * 0.125;
      auVar38._24_4_ = (auVar134._24_4_ + 6.0) * 0.125;
      auVar38._28_4_ = auVar134._28_4_ + 7.0;
      auVar8 = vfmadd213ps_fma(auVar38,local_680,local_900);
      auVar39._4_4_ = (auVar248._4_4_ + 1.0) * 0.125;
      auVar39._0_4_ = (auVar248._0_4_ + 0.0) * 0.125;
      auVar39._8_4_ = (auVar248._8_4_ + 2.0) * 0.125;
      auVar39._12_4_ = (auVar248._12_4_ + 3.0) * 0.125;
      auVar39._16_4_ = (auVar248._16_4_ + 4.0) * 0.125;
      auVar39._20_4_ = (auVar248._20_4_ + 5.0) * 0.125;
      auVar39._24_4_ = (auVar248._24_4_ + 6.0) * 0.125;
      auVar39._28_4_ = auVar248._28_4_ + 7.0;
      auVar172 = vfmadd213ps_fma(auVar39,local_680,local_900);
      auVar134 = vminps_avx(local_6a0,local_6c0);
      auVar248 = vminps_avx(local_6e0,local_820);
      auVar134 = vminps_avx(auVar134,auVar248);
      auVar134 = vsubps_avx(auVar134,_local_740);
      auVar85 = vandps_avx(auVar247,auVar85);
      local_1a0 = ZEXT1632(auVar8);
      local_1c0 = ZEXT1632(auVar172);
      auVar40._4_4_ = auVar134._4_4_ * 0.99999976;
      auVar40._0_4_ = auVar134._0_4_ * 0.99999976;
      auVar40._8_4_ = auVar134._8_4_ * 0.99999976;
      auVar40._12_4_ = auVar134._12_4_ * 0.99999976;
      auVar40._16_4_ = auVar134._16_4_ * 0.99999976;
      auVar40._20_4_ = auVar134._20_4_ * 0.99999976;
      auVar40._24_4_ = auVar134._24_4_ * 0.99999976;
      auVar40._28_4_ = 0x3f7ffffc;
      auVar247 = vmaxps_avx(ZEXT832(0) << 0x20,auVar40);
      auVar41._4_4_ = auVar247._4_4_ * auVar247._4_4_;
      auVar41._0_4_ = auVar247._0_4_ * auVar247._0_4_;
      auVar41._8_4_ = auVar247._8_4_ * auVar247._8_4_;
      auVar41._12_4_ = auVar247._12_4_ * auVar247._12_4_;
      auVar41._16_4_ = auVar247._16_4_ * auVar247._16_4_;
      auVar41._20_4_ = auVar247._20_4_ * auVar247._20_4_;
      auVar41._24_4_ = auVar247._24_4_ * auVar247._24_4_;
      auVar41._28_4_ = auVar247._28_4_;
      auVar134 = vsubps_avx(_local_700,auVar41);
      auVar42._4_4_ = auVar134._4_4_ * fVar125;
      auVar42._0_4_ = auVar134._0_4_ * fVar124;
      auVar42._8_4_ = auVar134._8_4_ * fStack_838;
      auVar42._12_4_ = auVar134._12_4_ * fStack_834;
      auVar42._16_4_ = auVar134._16_4_ * fStack_830;
      auVar42._20_4_ = auVar134._20_4_ * fStack_82c;
      auVar42._24_4_ = auVar134._24_4_ * fStack_828;
      auVar42._28_4_ = auVar247._28_4_;
      auVar248 = vsubps_avx(local_720,auVar42);
      auVar247 = vcmpps_avx(auVar248,ZEXT832(0) << 0x20,5);
      if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar247 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar247 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar247 >> 0x7f,0) == '\0') &&
            (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar247 >> 0xbf,0) == '\0') &&
          (auVar247 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar247[0x1f]) {
        auVar183 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar231 = ZEXT828(0) << 0x20;
        auVar116 = ZEXT1232(ZEXT412(0)) << 0x20;
        local_ac0 = ZEXT1232(ZEXT412(0)) << 0x20;
        _local_ae0 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar213._8_4_ = 0x7f800000;
        auVar213._0_8_ = 0x7f8000007f800000;
        auVar213._12_4_ = 0x7f800000;
        auVar213._16_4_ = 0x7f800000;
        auVar213._20_4_ = 0x7f800000;
        auVar213._24_4_ = 0x7f800000;
        auVar213._28_4_ = 0x7f800000;
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
      }
      else {
        local_860 = auVar247;
        local_820 = local_460;
        auVar137 = vrcpps_avx(local_2e0);
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar138._16_4_ = 0x3f800000;
        auVar138._20_4_ = 0x3f800000;
        auVar138._24_4_ = 0x3f800000;
        auVar138._28_4_ = 0x3f800000;
        auVar8 = vfnmadd213ps_fma(local_2e0,auVar137,auVar138);
        auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar137,auVar137);
        auVar137 = vsqrtps_avx(auVar248);
        auVar139._0_8_ = CONCAT44(fVar252,fVar246) ^ 0x8000000080000000;
        auVar139._8_4_ = -local_2c0._8_4_;
        auVar139._12_4_ = -local_2c0._12_4_;
        auVar139._16_4_ = -local_2c0._16_4_;
        auVar139._20_4_ = -local_2c0._20_4_;
        auVar139._24_4_ = -local_2c0._24_4_;
        auVar139._28_4_ = -local_2c0._28_4_;
        auVar183 = vsubps_avx(auVar139,auVar137);
        auVar137 = vsubps_avx(auVar137,local_2c0);
        auVar198._0_4_ = auVar183._0_4_ * auVar8._0_4_;
        auVar198._4_4_ = auVar183._4_4_ * auVar8._4_4_;
        auVar198._8_4_ = auVar183._8_4_ * auVar8._8_4_;
        auVar198._12_4_ = auVar183._12_4_ * auVar8._12_4_;
        auVar198._16_4_ = auVar183._16_4_ * 0.0;
        auVar198._20_4_ = auVar183._20_4_ * 0.0;
        auVar198._24_4_ = auVar183._24_4_ * 0.0;
        auVar198._28_4_ = 0;
        fVar96 = auVar137._0_4_ * auVar8._0_4_;
        fVar124 = auVar137._4_4_ * auVar8._4_4_;
        auVar43._4_4_ = fVar124;
        auVar43._0_4_ = fVar96;
        fVar125 = auVar137._8_4_ * auVar8._8_4_;
        auVar43._8_4_ = fVar125;
        fVar187 = auVar137._12_4_ * auVar8._12_4_;
        auVar43._12_4_ = fVar187;
        fVar201 = auVar137._16_4_ * 0.0;
        auVar43._16_4_ = fVar201;
        fVar202 = auVar137._20_4_ * 0.0;
        auVar43._20_4_ = fVar202;
        fVar203 = auVar137._24_4_ * 0.0;
        auVar43._24_4_ = fVar203;
        auVar43._28_4_ = local_460._28_4_;
        auVar8 = vfmadd213ps_fma(auVar261,auVar198,auVar116);
        auVar172 = vfmadd213ps_fma(auVar261,auVar43,auVar116);
        auVar44._28_4_ = auVar183._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar126 * auVar8._12_4_,
                                CONCAT48(fVar127 * auVar8._8_4_,
                                         CONCAT44(fVar123 * auVar8._4_4_,fVar122 * auVar8._0_4_))));
        auVar137 = ZEXT1632(CONCAT412(auVar172._12_4_ * fVar126,
                                      CONCAT48(auVar172._8_4_ * fVar127,
                                               CONCAT44(auVar172._4_4_ * fVar123,
                                                        auVar172._0_4_ * fVar122))));
        auVar8 = vfmadd213ps_fma(local_580,auVar44,auVar178);
        auVar172 = vfmadd213ps_fma(local_580,auVar137,auVar178);
        auVar194 = vfmadd213ps_fma(local_280,auVar44,local_540);
        auVar78 = vfmadd213ps_fma(local_280,auVar137,local_540);
        auVar218 = vfmadd213ps_fma(auVar44,local_560,local_520);
        auVar73 = vfmadd213ps_fma(local_560,auVar137,local_520);
        auVar45._4_4_ = (float)local_500._4_4_ * auVar198._4_4_;
        auVar45._0_4_ = (float)local_500._0_4_ * auVar198._0_4_;
        auVar45._8_4_ = fStack_4f8 * auVar198._8_4_;
        auVar45._12_4_ = fStack_4f4 * auVar198._12_4_;
        auVar45._16_4_ = fStack_4f0 * auVar198._16_4_;
        auVar45._20_4_ = fStack_4ec * auVar198._20_4_;
        auVar45._24_4_ = fStack_4e8 * auVar198._24_4_;
        auVar45._28_4_ = 0;
        local_ac0 = vsubps_avx(auVar45,ZEXT1632(auVar8));
        auVar162._0_4_ = (float)local_4e0._0_4_ * auVar198._0_4_;
        auVar162._4_4_ = (float)local_4e0._4_4_ * auVar198._4_4_;
        auVar162._8_4_ = fStack_4d8 * auVar198._8_4_;
        auVar162._12_4_ = fStack_4d4 * auVar198._12_4_;
        auVar162._16_4_ = fStack_4d0 * auVar198._16_4_;
        auVar162._20_4_ = fStack_4cc * auVar198._20_4_;
        auVar162._24_4_ = fStack_4c8 * auVar198._24_4_;
        auVar162._28_4_ = 0;
        auVar116 = vsubps_avx(auVar162,ZEXT1632(auVar194));
        auVar184._0_4_ = local_620 * auVar198._0_4_;
        auVar184._4_4_ = fStack_61c * auVar198._4_4_;
        auVar184._8_4_ = fStack_618 * auVar198._8_4_;
        auVar184._12_4_ = fStack_614 * auVar198._12_4_;
        auVar184._16_4_ = fStack_610 * auVar198._16_4_;
        auVar184._20_4_ = fStack_60c * auVar198._20_4_;
        auVar184._24_4_ = fStack_608 * auVar198._24_4_;
        auVar184._28_4_ = 0;
        auVar137 = vsubps_avx(auVar184,ZEXT1632(auVar218));
        _local_ae0 = auVar137._0_28_;
        auVar46._4_4_ = fVar124 * (float)local_500._4_4_;
        auVar46._0_4_ = fVar96 * (float)local_500._0_4_;
        auVar46._8_4_ = fVar125 * fStack_4f8;
        auVar46._12_4_ = fVar187 * fStack_4f4;
        auVar46._16_4_ = fVar201 * fStack_4f0;
        auVar46._20_4_ = fVar202 * fStack_4ec;
        auVar46._24_4_ = fVar203 * fStack_4e8;
        auVar46._28_4_ = auVar137._28_4_;
        auVar137 = vsubps_avx(auVar46,ZEXT1632(auVar172));
        auVar47._4_4_ = fVar124 * (float)local_4e0._4_4_;
        auVar47._0_4_ = fVar96 * (float)local_4e0._0_4_;
        auVar47._8_4_ = fVar125 * fStack_4d8;
        auVar47._12_4_ = fVar187 * fStack_4d4;
        auVar47._16_4_ = fVar201 * fStack_4d0;
        auVar47._20_4_ = fVar202 * fStack_4cc;
        auVar47._24_4_ = fVar203 * fStack_4c8;
        auVar47._28_4_ = 0;
        auVar183 = vsubps_avx(auVar47,ZEXT1632(auVar78));
        auVar48._4_4_ = fStack_61c * fVar124;
        auVar48._0_4_ = local_620 * fVar96;
        auVar48._8_4_ = fStack_618 * fVar125;
        auVar48._12_4_ = fStack_614 * fVar187;
        auVar48._16_4_ = fStack_610 * fVar201;
        auVar48._20_4_ = fStack_60c * fVar202;
        auVar48._24_4_ = fStack_608 * fVar203;
        auVar48._28_4_ = uVar66;
        auVar178 = vsubps_avx(auVar48,ZEXT1632(auVar73));
        auVar231 = auVar178._0_28_;
        auVar178 = vcmpps_avx(auVar248,ZEXT432(0) << 0x20,5);
        auVar214._8_4_ = 0x7f800000;
        auVar214._0_8_ = 0x7f8000007f800000;
        auVar214._12_4_ = 0x7f800000;
        auVar214._16_4_ = 0x7f800000;
        auVar214._20_4_ = 0x7f800000;
        auVar214._24_4_ = 0x7f800000;
        auVar214._28_4_ = 0x7f800000;
        auVar213 = vblendvps_avx(auVar214,auVar198,auVar178);
        auVar248 = vandps_avx(local_640,local_2a0);
        auVar248 = vmaxps_avx(local_420,auVar248);
        auVar49._4_4_ = auVar248._4_4_ * 1.9073486e-06;
        auVar49._0_4_ = auVar248._0_4_ * 1.9073486e-06;
        auVar49._8_4_ = auVar248._8_4_ * 1.9073486e-06;
        auVar49._12_4_ = auVar248._12_4_ * 1.9073486e-06;
        auVar49._16_4_ = auVar248._16_4_ * 1.9073486e-06;
        auVar49._20_4_ = auVar248._20_4_ * 1.9073486e-06;
        auVar49._24_4_ = auVar248._24_4_ * 1.9073486e-06;
        auVar49._28_4_ = auVar248._28_4_;
        auVar240 = vandps_avx(local_640,auVar240);
        auVar240 = vcmpps_avx(auVar240,auVar49,1);
        auVar221._8_4_ = 0xff800000;
        auVar221._0_8_ = 0xff800000ff800000;
        auVar221._12_4_ = 0xff800000;
        auVar221._16_4_ = 0xff800000;
        auVar221._20_4_ = 0xff800000;
        auVar221._24_4_ = 0xff800000;
        auVar221._28_4_ = 0xff800000;
        auVar220 = vblendvps_avx(auVar221,auVar43,auVar178);
        auVar248 = auVar178 & auVar240;
        if ((((((((auVar248 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar248 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar248 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar248 >> 0x7f,0) != '\0') ||
              (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar248 >> 0xbf,0) != '\0') ||
            (auVar248 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar248[0x1f] < '\0') {
          auVar240 = vandps_avx(auVar178,auVar240);
          auVar134 = vcmpps_avx(auVar134,ZEXT832(0) << 0x20,2);
          auVar238._8_4_ = 0xff800000;
          auVar238._0_8_ = 0xff800000ff800000;
          auVar238._12_4_ = 0xff800000;
          auVar238._16_4_ = 0xff800000;
          auVar238._20_4_ = 0xff800000;
          auVar238._24_4_ = 0xff800000;
          auVar238._28_4_ = 0xff800000;
          auVar265._8_4_ = 0x7f800000;
          auVar265._0_8_ = 0x7f8000007f800000;
          auVar265._12_4_ = 0x7f800000;
          auVar265._16_4_ = 0x7f800000;
          auVar265._20_4_ = 0x7f800000;
          auVar265._24_4_ = 0x7f800000;
          auVar265._28_4_ = 0x7f800000;
          auVar247 = vblendvps_avx(auVar265,auVar238,auVar134);
          auVar8 = vpackssdw_avx(auVar240._0_16_,auVar240._16_16_);
          auVar248 = vpmovsxwd_avx2(auVar8);
          auVar213 = vblendvps_avx(auVar213,auVar247,auVar248);
          auVar247 = vblendvps_avx(auVar238,auVar265,auVar134);
          auVar220 = vblendvps_avx(auVar220,auVar247,auVar248);
          auVar200._0_8_ = auVar240._0_8_ ^ 0xffffffffffffffff;
          auVar200._8_4_ = auVar240._8_4_ ^ 0xffffffff;
          auVar200._12_4_ = auVar240._12_4_ ^ 0xffffffff;
          auVar200._16_4_ = auVar240._16_4_ ^ 0xffffffff;
          auVar200._20_4_ = auVar240._20_4_ ^ 0xffffffff;
          auVar200._24_4_ = auVar240._24_4_ ^ 0xffffffff;
          auVar200._28_4_ = auVar240._28_4_ ^ 0xffffffff;
          auVar240 = vorps_avx(auVar134,auVar200);
          auVar247 = vandps_avx(auVar178,auVar240);
        }
      }
      uVar66 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
      auVar199._4_4_ = uVar66;
      auVar199._0_4_ = uVar66;
      auVar199._8_4_ = uVar66;
      auVar199._12_4_ = uVar66;
      auVar199._16_4_ = uVar66;
      auVar199._20_4_ = uVar66;
      auVar199._24_4_ = uVar66;
      auVar199._28_4_ = uVar66;
      uVar66 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
      auVar245._4_4_ = uVar66;
      auVar245._0_4_ = uVar66;
      auVar245._8_4_ = uVar66;
      auVar245._12_4_ = uVar66;
      auVar245._16_4_ = uVar66;
      auVar245._20_4_ = uVar66;
      auVar245._24_4_ = uVar66;
      auVar245._28_4_ = uVar66;
      fVar96 = (ray->super_RayK<1>).dir.field_0.m128[2];
      local_440 = vminps_avx(local_480,auVar213);
      _local_4a0 = vmaxps_avx(local_460,auVar220);
      auVar240 = vcmpps_avx(local_460,local_440,2);
      local_520 = vandps_avx(auVar85,auVar240);
      auVar240 = vcmpps_avx(_local_4a0,local_480,2);
      local_720 = vandps_avx(auVar85,auVar240);
      auVar85 = vorps_avx(local_720,local_520);
      if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar85 >> 0x7f,0) == '\0') &&
            (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar85 >> 0xbf,0) == '\0') &&
          (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar85[0x1f])
      goto LAB_0113a6d8;
      _local_700 = _local_4a0;
      local_840 = uVar64;
      auVar50._4_4_ = auVar231._4_4_ * fVar96;
      auVar50._0_4_ = auVar231._0_4_ * fVar96;
      auVar50._8_4_ = auVar231._8_4_ * fVar96;
      auVar50._12_4_ = auVar231._12_4_ * fVar96;
      auVar50._16_4_ = auVar231._16_4_ * fVar96;
      auVar50._20_4_ = auVar231._20_4_ * fVar96;
      auVar50._24_4_ = auVar231._24_4_ * fVar96;
      auVar50._28_4_ = auVar85._28_4_;
      auVar8 = vfmadd213ps_fma(auVar183,auVar245,auVar50);
      auVar51._4_4_ = fVar96 * (float)local_ae0._4_4_;
      auVar51._0_4_ = fVar96 * (float)local_ae0._0_4_;
      auVar51._8_4_ = fVar96 * fStack_ad8;
      auVar51._12_4_ = fVar96 * fStack_ad4;
      auVar51._16_4_ = fVar96 * fStack_ad0;
      auVar51._20_4_ = fVar96 * fStack_acc;
      auVar51._24_4_ = fVar96 * fStack_ac8;
      auVar51._28_4_ = auVar85._28_4_;
      auVar172 = vfmadd213ps_fma(auVar116,auVar245,auVar51);
      auVar8 = vfmadd213ps_fma(auVar137,auVar199,ZEXT1632(auVar8));
      auVar90._0_8_ = auVar247._0_8_ ^ 0xffffffffffffffff;
      auVar90._8_4_ = auVar247._8_4_ ^ 0xffffffff;
      auVar90._12_4_ = auVar247._12_4_ ^ 0xffffffff;
      auVar90._16_4_ = auVar247._16_4_ ^ 0xffffffff;
      auVar90._20_4_ = auVar247._20_4_ ^ 0xffffffff;
      auVar90._24_4_ = auVar247._24_4_ ^ 0xffffffff;
      auVar90._28_4_ = auVar247._28_4_ ^ 0xffffffff;
      auVar85 = vandps_avx(ZEXT1632(auVar8),local_640);
      auVar185._8_4_ = 0x3e99999a;
      auVar185._0_8_ = 0x3e99999a3e99999a;
      auVar185._12_4_ = 0x3e99999a;
      auVar185._16_4_ = 0x3e99999a;
      auVar185._20_4_ = 0x3e99999a;
      auVar185._24_4_ = 0x3e99999a;
      auVar185._28_4_ = 0x3e99999a;
      auVar85 = vcmpps_avx(auVar85,auVar185,1);
      local_560 = vorps_avx(auVar85,auVar90);
      auVar8 = vfmadd213ps_fma(local_ac0,auVar199,ZEXT1632(auVar172));
      auVar85 = vandps_avx(ZEXT1632(auVar8),local_640);
      auVar85 = vcmpps_avx(auVar85,auVar185,1);
      auVar85 = vorps_avx(auVar85,auVar90);
      auVar119._8_4_ = 3;
      auVar119._0_8_ = 0x300000003;
      auVar119._12_4_ = 3;
      auVar119._16_4_ = 3;
      auVar119._20_4_ = 3;
      auVar119._24_4_ = 3;
      auVar119._28_4_ = 3;
      auVar141._8_4_ = 2;
      auVar141._0_8_ = 0x200000002;
      auVar141._12_4_ = 2;
      auVar141._16_4_ = 2;
      auVar141._20_4_ = 2;
      auVar141._24_4_ = 2;
      auVar141._28_4_ = 2;
      auVar85 = vblendvps_avx(auVar141,auVar119,auVar85);
      local_580._4_4_ = local_aec;
      local_580._0_4_ = local_aec;
      local_580._8_4_ = local_aec;
      local_580._12_4_ = local_aec;
      local_580._16_4_ = local_aec;
      local_580._20_4_ = local_aec;
      local_580._24_4_ = local_aec;
      local_580._28_4_ = local_aec;
      local_540 = vpcmpgtd_avx2(auVar85,local_580);
      auVar85 = vpandn_avx2(local_540,local_520);
      local_820 = local_460;
      local_740._4_4_ = local_460._4_4_ + (float)local_600._4_4_;
      local_740._0_4_ = local_460._0_4_ + (float)local_600._0_4_;
      fStack_738 = local_460._8_4_ + fStack_5f8;
      fStack_734 = local_460._12_4_ + fStack_5f4;
      fStack_730 = local_460._16_4_ + fStack_5f0;
      fStack_72c = local_460._20_4_ + fStack_5ec;
      fStack_728 = local_460._24_4_ + fStack_5e8;
      fStack_724 = local_460._28_4_ + fStack_5e4;
      auVar225 = ZEXT3264(local_a40);
      local_9a0 = auVar241;
      local_7a0 = auVar111;
      while( true ) {
        local_3c0 = auVar85;
        if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar85 >> 0x7f,0) == '\0') &&
              (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar85 >> 0xbf,0) == '\0') &&
            (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar85[0x1f]) break;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar240 = vblendvps_avx(auVar120,local_820,auVar85);
        auVar247 = vshufps_avx(auVar240,auVar240,0xb1);
        auVar247 = vminps_avx(auVar240,auVar247);
        auVar134 = vshufpd_avx(auVar247,auVar247,5);
        auVar247 = vminps_avx(auVar247,auVar134);
        auVar134 = vpermpd_avx2(auVar247,0x4e);
        auVar247 = vminps_avx(auVar247,auVar134);
        auVar240 = vcmpps_avx(auVar240,auVar247,0);
        auVar247 = auVar85 & auVar240;
        if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar247 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar247 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar247 >> 0x7f,0) != '\0') ||
              (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar247 >> 0xbf,0) != '\0') ||
            (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar247[0x1f] < '\0') {
          auVar85 = vandps_avx(auVar240,auVar85);
        }
        uVar60 = vmovmskps_avx(auVar85);
        iVar9 = 0;
        for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
          iVar9 = iVar9 + 1;
        }
        uVar63 = iVar9 << 2;
        *(undefined4 *)(local_3c0 + uVar63) = 0;
        aVar1 = (ray->super_RayK<1>).dir.field_0;
        local_7e0._0_16_ = (undefined1  [16])aVar1;
        auVar8 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
        uVar60 = *(uint *)(local_1a0 + uVar63);
        uVar63 = *(uint *)(local_460 + uVar63);
        if (auVar8._0_4_ < 0.0) {
          fVar96 = sqrtf(auVar8._0_4_);
          auVar225 = ZEXT3264(local_a40);
        }
        else {
          auVar8 = vsqrtss_avx(auVar8,auVar8);
          fVar96 = auVar8._0_4_;
        }
        auVar172 = vminps_avx(local_9b0,local_9d0);
        auVar8 = vmaxps_avx(local_9b0,local_9d0);
        auVar194 = vminps_avx(local_9c0,_local_9e0);
        auVar78 = vminps_avx(auVar172,auVar194);
        auVar172 = vmaxps_avx(local_9c0,_local_9e0);
        auVar194 = vmaxps_avx(auVar8,auVar172);
        auVar8 = vandps_avx(auVar78,local_9f0);
        auVar172 = vandps_avx(auVar194,local_9f0);
        auVar8 = vmaxps_avx(auVar8,auVar172);
        auVar172 = vmovshdup_avx(auVar8);
        auVar172 = vmaxss_avx(auVar172,auVar8);
        auVar8 = vshufpd_avx(auVar8,auVar8,1);
        auVar8 = vmaxss_avx(auVar8,auVar172);
        local_860._0_4_ = auVar8._0_4_ * 1.9073486e-06;
        local_880._0_4_ = fVar96 * 1.9073486e-06;
        local_6e0._0_16_ = vshufps_avx(auVar194,auVar194,0xff);
        auVar8 = vinsertps_avx(ZEXT416(uVar63),ZEXT416(uVar60),0x10);
        auVar239 = ZEXT1664(auVar8);
        lVar62 = 5;
        do {
          do {
            bVar68 = lVar62 == 0;
            lVar62 = lVar62 + -1;
            if (bVar68) goto LAB_0113b092;
            auVar218 = auVar239._0_16_;
            local_960._0_16_ = vmovshdup_avx(auVar218);
            fVar127 = 1.0 - local_960._0_4_;
            auVar8 = vshufps_avx(auVar218,auVar218,0x55);
            fVar96 = auVar8._0_4_;
            auVar99._0_4_ = local_9d0._0_4_ * fVar96;
            fVar122 = auVar8._4_4_;
            auVar99._4_4_ = local_9d0._4_4_ * fVar122;
            fVar123 = auVar8._8_4_;
            auVar99._8_4_ = local_9d0._8_4_ * fVar123;
            fVar124 = auVar8._12_4_;
            auVar99._12_4_ = local_9d0._12_4_ * fVar124;
            auVar129._4_4_ = fVar127;
            auVar129._0_4_ = fVar127;
            auVar129._8_4_ = fVar127;
            auVar129._12_4_ = fVar127;
            auVar8 = vfmadd231ps_fma(auVar99,auVar129,local_9b0);
            auVar146._0_4_ = local_9c0._0_4_ * fVar96;
            auVar146._4_4_ = local_9c0._4_4_ * fVar122;
            auVar146._8_4_ = local_9c0._8_4_ * fVar123;
            auVar146._12_4_ = local_9c0._12_4_ * fVar124;
            auVar172 = vfmadd231ps_fma(auVar146,auVar129,local_9d0);
            auVar193._0_4_ = fVar96 * auVar172._0_4_;
            auVar193._4_4_ = fVar122 * auVar172._4_4_;
            auVar193._8_4_ = fVar123 * auVar172._8_4_;
            auVar193._12_4_ = fVar124 * auVar172._12_4_;
            auVar194 = vfmadd231ps_fma(auVar193,auVar129,auVar8);
            auVar100._0_4_ = fVar96 * (float)local_9e0._0_4_;
            auVar100._4_4_ = fVar122 * (float)local_9e0._4_4_;
            auVar100._8_4_ = fVar123 * fStack_9d8;
            auVar100._12_4_ = fVar124 * fStack_9d4;
            auVar8 = vfmadd231ps_fma(auVar100,auVar129,local_9c0);
            auVar171._0_4_ = fVar96 * auVar8._0_4_;
            auVar171._4_4_ = fVar122 * auVar8._4_4_;
            auVar171._8_4_ = fVar123 * auVar8._8_4_;
            auVar171._12_4_ = fVar124 * auVar8._12_4_;
            auVar172 = vfmadd231ps_fma(auVar171,auVar129,auVar172);
            uVar66 = auVar239._0_4_;
            auVar101._4_4_ = uVar66;
            auVar101._0_4_ = uVar66;
            auVar101._8_4_ = uVar66;
            auVar101._12_4_ = uVar66;
            auVar8 = vfmadd213ps_fma(auVar101,local_7e0._0_16_,_DAT_01f45a50);
            auVar77._0_4_ = fVar96 * auVar172._0_4_;
            auVar77._4_4_ = fVar122 * auVar172._4_4_;
            auVar77._8_4_ = fVar123 * auVar172._8_4_;
            auVar77._12_4_ = fVar124 * auVar172._12_4_;
            auVar78 = vfmadd231ps_fma(auVar77,auVar194,auVar129);
            local_660._0_16_ = auVar78;
            auVar8 = vsubps_avx(auVar8,auVar78);
            _local_780 = auVar8;
            auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
            fVar96 = auVar8._0_4_;
            if (fVar96 < 0.0) {
              local_980._0_16_ = ZEXT416((uint)fVar127);
              local_a20._0_16_ = auVar194;
              local_9a0._0_16_ = auVar172;
              auVar250._0_4_ = sqrtf(fVar96);
              auVar250._4_60_ = extraout_var;
              auVar239 = ZEXT1664(auVar218);
              auVar78 = auVar250._0_16_;
              auVar172 = local_9a0._0_16_;
              auVar194 = local_a20._0_16_;
              auVar73 = local_980._0_16_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar8,auVar8);
              auVar73 = ZEXT416((uint)fVar127);
            }
            auVar172 = vsubps_avx(auVar172,auVar194);
            auVar208._0_4_ = auVar172._0_4_ * 3.0;
            auVar208._4_4_ = auVar172._4_4_ * 3.0;
            auVar208._8_4_ = auVar172._8_4_ * 3.0;
            auVar208._12_4_ = auVar172._12_4_ * 3.0;
            auVar172 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar73,local_960._0_16_);
            auVar194 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar73);
            fVar122 = auVar73._0_4_ * 6.0;
            fVar123 = auVar172._0_4_ * 6.0;
            fVar124 = auVar194._0_4_ * 6.0;
            fVar127 = local_960._0_4_ * 6.0;
            auVar147._0_4_ = fVar127 * (float)local_9e0._0_4_;
            auVar147._4_4_ = fVar127 * (float)local_9e0._4_4_;
            auVar147._8_4_ = fVar127 * fStack_9d8;
            auVar147._12_4_ = fVar127 * fStack_9d4;
            auVar102._4_4_ = fVar124;
            auVar102._0_4_ = fVar124;
            auVar102._8_4_ = fVar124;
            auVar102._12_4_ = fVar124;
            auVar172 = vfmadd132ps_fma(auVar102,auVar147,local_9c0);
            auVar148._4_4_ = fVar123;
            auVar148._0_4_ = fVar123;
            auVar148._8_4_ = fVar123;
            auVar148._12_4_ = fVar123;
            auVar172 = vfmadd132ps_fma(auVar148,auVar172,local_9d0);
            auVar194 = vdpps_avx(auVar208,auVar208,0x7f);
            auVar103._4_4_ = fVar122;
            auVar103._0_4_ = fVar122;
            auVar103._8_4_ = fVar122;
            auVar103._12_4_ = fVar122;
            auVar72 = vfmadd132ps_fma(auVar103,auVar172,local_9b0);
            auVar172 = vblendps_avx(auVar194,_DAT_01f45a50,0xe);
            auVar73 = vrsqrtss_avx(auVar172,auVar172);
            fVar124 = auVar194._0_4_;
            fVar122 = auVar73._0_4_;
            auVar73 = vdpps_avx(auVar208,auVar72,0x7f);
            fVar122 = fVar122 * 1.5 + fVar124 * -0.5 * fVar122 * fVar122 * fVar122;
            auVar104._0_4_ = auVar72._0_4_ * fVar124;
            auVar104._4_4_ = auVar72._4_4_ * fVar124;
            auVar104._8_4_ = auVar72._8_4_ * fVar124;
            auVar104._12_4_ = auVar72._12_4_ * fVar124;
            fVar123 = auVar73._0_4_;
            auVar195._0_4_ = auVar208._0_4_ * fVar123;
            auVar195._4_4_ = auVar208._4_4_ * fVar123;
            auVar195._8_4_ = auVar208._8_4_ * fVar123;
            auVar195._12_4_ = auVar208._12_4_ * fVar123;
            auVar73 = vsubps_avx(auVar104,auVar195);
            auVar172 = vrcpss_avx(auVar172,auVar172);
            auVar72 = vfnmadd213ss_fma(auVar172,auVar194,ZEXT416(0x40000000));
            fVar123 = auVar172._0_4_ * auVar72._0_4_;
            auVar172 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                  ZEXT416((uint)(auVar239._0_4_ * (float)local_880._0_4_)));
            auVar242 = ZEXT1664(auVar172);
            uVar64 = CONCAT44(auVar208._4_4_,auVar208._0_4_);
            auVar219._0_8_ = uVar64 ^ 0x8000000080000000;
            auVar219._8_4_ = -auVar208._8_4_;
            auVar219._12_4_ = -auVar208._12_4_;
            auVar149._0_4_ = fVar122 * auVar73._0_4_ * fVar123;
            auVar149._4_4_ = fVar122 * auVar73._4_4_ * fVar123;
            auVar149._8_4_ = fVar122 * auVar73._8_4_ * fVar123;
            auVar149._12_4_ = fVar122 * auVar73._12_4_ * fVar123;
            auVar229._0_4_ = auVar208._0_4_ * fVar122;
            auVar229._4_4_ = auVar208._4_4_ * fVar122;
            auVar229._8_4_ = auVar208._8_4_ * fVar122;
            auVar229._12_4_ = auVar208._12_4_ * fVar122;
            local_960._0_16_ = auVar208;
            local_980._0_4_ = auVar172._0_4_;
            if (fVar124 < -fVar124) {
              local_a20._0_4_ = auVar78._0_4_;
              local_9a0._0_16_ = auVar219;
              local_7a0._0_16_ = auVar229;
              local_900._0_16_ = auVar149;
              fVar122 = sqrtf(fVar124);
              auVar78 = ZEXT416((uint)local_a20._0_4_);
              auVar242 = ZEXT464((uint)local_980._0_4_);
              auVar149 = local_900._0_16_;
              auVar219 = local_9a0._0_16_;
              auVar229 = local_7a0._0_16_;
            }
            else {
              auVar172 = vsqrtss_avx(auVar194,auVar194);
              fVar122 = auVar172._0_4_;
            }
            auVar172 = vdpps_avx(_local_780,auVar229,0x7f);
            auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar78,auVar242._0_16_);
            auVar194 = vdpps_avx(auVar219,auVar229,0x7f);
            auVar73 = vdpps_avx(_local_780,auVar149,0x7f);
            auVar72 = vdpps_avx(local_7e0._0_16_,auVar229,0x7f);
            auVar71 = vfmadd213ss_fma(ZEXT416((uint)(auVar78._0_4_ + 1.0)),
                                      ZEXT416((uint)((float)local_860._0_4_ / fVar122)),auVar130);
            auVar79._0_4_ = auVar172._0_4_ * auVar172._0_4_;
            auVar79._4_4_ = auVar172._4_4_ * auVar172._4_4_;
            auVar79._8_4_ = auVar172._8_4_ * auVar172._8_4_;
            auVar79._12_4_ = auVar172._12_4_ * auVar172._12_4_;
            auVar78 = vdpps_avx(_local_780,auVar219,0x7f);
            auVar98 = vsubps_avx(auVar8,auVar79);
            auVar130 = vrsqrtss_avx(auVar98,auVar98);
            fVar123 = auVar98._0_4_;
            fVar122 = auVar130._0_4_;
            fVar122 = fVar122 * 1.5 + fVar123 * -0.5 * fVar122 * fVar122 * fVar122;
            auVar130 = vdpps_avx(_local_780,local_7e0._0_16_,0x7f);
            local_a20._0_16_ = ZEXT416((uint)(auVar194._0_4_ + auVar73._0_4_));
            auVar194 = vfnmadd231ss_fma(auVar78,auVar172,local_a20._0_16_);
            auVar78 = vfnmadd231ss_fma(auVar130,auVar172,auVar72);
            if (fVar123 < 0.0) {
              local_9a0._0_16_ = auVar172;
              local_7a0._0_4_ = auVar71._0_4_;
              local_900._0_16_ = auVar72;
              local_680._0_16_ = auVar194;
              local_6a0._0_4_ = fVar122;
              local_6c0._0_16_ = auVar78;
              fVar123 = sqrtf(fVar123);
              auVar242 = ZEXT464((uint)local_980._0_4_);
              fVar122 = (float)local_6a0._0_4_;
              auVar78 = local_6c0._0_16_;
              auVar194 = local_680._0_16_;
              auVar172 = local_9a0._0_16_;
              auVar72 = local_900._0_16_;
              fVar124 = (float)local_7a0._0_4_;
            }
            else {
              auVar73 = vsqrtss_avx(auVar98,auVar98);
              fVar123 = auVar73._0_4_;
              fVar124 = auVar71._0_4_;
            }
            auVar225 = ZEXT3264(local_a40);
            auVar73 = vpermilps_avx(local_660._0_16_,0xff);
            fVar123 = fVar123 - auVar73._0_4_;
            auVar73 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
            auVar194 = vfmsub213ss_fma(auVar194,ZEXT416((uint)fVar122),auVar73);
            auVar150._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
            auVar150._8_4_ = auVar72._8_4_ ^ 0x80000000;
            auVar150._12_4_ = auVar72._12_4_ ^ 0x80000000;
            auVar173._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
            auVar173._8_4_ = auVar194._8_4_ ^ 0x80000000;
            auVar173._12_4_ = auVar194._12_4_ ^ 0x80000000;
            auVar130 = ZEXT416((uint)(auVar78._0_4_ * fVar122));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar194._0_4_)),
                                      local_a20._0_16_,auVar130);
            auVar194 = vinsertps_avx(auVar173,auVar130,0x1c);
            uVar66 = auVar78._0_4_;
            auVar174._4_4_ = uVar66;
            auVar174._0_4_ = uVar66;
            auVar174._8_4_ = uVar66;
            auVar174._12_4_ = uVar66;
            auVar194 = vdivps_avx(auVar194,auVar174);
            auVar78 = vinsertps_avx(local_a20._0_16_,auVar150,0x10);
            auVar78 = vdivps_avx(auVar78,auVar174);
            fVar122 = auVar172._0_4_;
            auVar131._0_4_ = fVar122 * auVar194._0_4_ + fVar123 * auVar78._0_4_;
            auVar131._4_4_ = fVar122 * auVar194._4_4_ + fVar123 * auVar78._4_4_;
            auVar131._8_4_ = fVar122 * auVar194._8_4_ + fVar123 * auVar78._8_4_;
            auVar131._12_4_ = fVar122 * auVar194._12_4_ + fVar123 * auVar78._12_4_;
            auVar194 = vsubps_avx(auVar218,auVar131);
            auVar239 = ZEXT1664(auVar194);
            auVar172 = vandps_avx(auVar172,local_9f0);
          } while (fVar124 <= auVar172._0_4_);
          auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar242._0_4_ + fVar124)),local_6e0._0_16_,
                                    ZEXT416(0x36000000));
          auVar172 = vandps_avx(ZEXT416((uint)fVar123),local_9f0);
        } while (auVar78._0_4_ <= auVar172._0_4_);
        fVar122 = auVar194._0_4_ + (float)local_760._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar122) &&
           (fVar123 = (ray->super_RayK<1>).tfar, fVar122 <= fVar123)) {
          auVar172 = vmovshdup_avx(auVar194);
          fVar124 = auVar172._0_4_;
          if ((0.0 <= fVar124) && (fVar124 <= 1.0)) {
            auVar8 = vrsqrtss_avx(auVar8,auVar8);
            fVar127 = auVar8._0_4_;
            pGVar4 = (context->scene->geometries).items[uVar67].ptr;
            if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar96 = fVar127 * 1.5 + fVar96 * -0.5 * fVar127 * fVar127 * fVar127;
              auVar151._0_4_ = fVar96 * (float)local_780._0_4_;
              auVar151._4_4_ = fVar96 * (float)local_780._4_4_;
              auVar151._8_4_ = fVar96 * fStack_778;
              auVar151._12_4_ = fVar96 * fStack_774;
              auVar78 = vfmadd213ps_fma(auVar73,auVar151,local_960._0_16_);
              auVar8 = vshufps_avx(auVar151,auVar151,0xc9);
              auVar172 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
              auVar152._0_4_ = auVar151._0_4_ * auVar172._0_4_;
              auVar152._4_4_ = auVar151._4_4_ * auVar172._4_4_;
              auVar152._8_4_ = auVar151._8_4_ * auVar172._8_4_;
              auVar152._12_4_ = auVar151._12_4_ * auVar172._12_4_;
              auVar194 = vfmsub231ps_fma(auVar152,local_960._0_16_,auVar8);
              auVar8 = vshufps_avx(auVar194,auVar194,0xc9);
              auVar172 = vshufps_avx(auVar78,auVar78,0xc9);
              auVar194 = vshufps_avx(auVar194,auVar194,0xd2);
              auVar80._0_4_ = auVar78._0_4_ * auVar194._0_4_;
              auVar80._4_4_ = auVar78._4_4_ * auVar194._4_4_;
              auVar80._8_4_ = auVar78._8_4_ * auVar194._8_4_;
              auVar80._12_4_ = auVar78._12_4_ * auVar194._12_4_;
              auVar172 = vfmsub231ps_fma(auVar80,auVar8,auVar172);
              auVar8 = vshufps_avx(auVar172,auVar172,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar122;
                uVar69 = vmovlps_avx(auVar8);
                *(undefined8 *)&(ray->Ng).field_0 = uVar69;
                (ray->Ng).field_0.field_0.z = auVar172._0_4_;
                ray->u = fVar124;
                ray->v = 0.0;
                ray->primID = (uint)local_840;
                ray->geomID = uVar67;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_930 = vmovlps_avx(auVar8);
                local_928 = auVar172._0_4_;
                local_924 = fVar124;
                local_920 = 0;
                local_91c = (uint)local_840;
                local_918 = uVar67;
                local_914 = context->user->instID[0];
                local_910 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar122;
                local_5e0._0_4_ = 0xffffffff;
                local_a78.valid = (int *)local_5e0;
                local_a78.geometryUserPtr = pGVar4->userPtr;
                local_a78.context = context->user;
                local_a78.hit = (RTCHitN *)&local_930;
                local_a78.N = 1;
                local_a78.ray = (RTCRayN *)ray;
                if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113b1ae:
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)(&local_a78);
                    auVar225 = ZEXT3264(local_a40);
                    if (*local_a78.valid == 0) goto LAB_0113b25d;
                  }
                  (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                       *(float *)local_a78.hit;
                  (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_a78.hit + 4);
                  (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_a78.hit + 8);
                  *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc);
                  *(float *)((long)local_a78.ray + 0x40) = *(float *)(local_a78.hit + 0x10);
                  *(float *)((long)local_a78.ray + 0x44) = *(float *)(local_a78.hit + 0x14);
                  *(float *)((long)local_a78.ray + 0x48) = *(float *)(local_a78.hit + 0x18);
                  *(float *)((long)local_a78.ray + 0x4c) = *(float *)(local_a78.hit + 0x1c);
                  *(float *)((long)local_a78.ray + 0x50) = *(float *)(local_a78.hit + 0x20);
                }
                else {
                  (*pGVar4->intersectionFilterN)(&local_a78);
                  auVar225 = ZEXT3264(local_a40);
                  if (*local_a78.valid != 0) goto LAB_0113b1ae;
LAB_0113b25d:
                  (ray->super_RayK<1>).tfar = fVar123;
                }
              }
            }
          }
        }
LAB_0113b092:
        fVar96 = (ray->super_RayK<1>).tfar;
        auVar91._4_4_ = fVar96;
        auVar91._0_4_ = fVar96;
        auVar91._8_4_ = fVar96;
        auVar91._12_4_ = fVar96;
        auVar91._16_4_ = fVar96;
        auVar91._20_4_ = fVar96;
        auVar91._24_4_ = fVar96;
        auVar91._28_4_ = fVar96;
        auVar85 = vcmpps_avx(_local_740,auVar91,2);
        auVar85 = vandps_avx(auVar85,local_3c0);
      }
      auVar92._0_4_ = (float)local_600._0_4_ + (float)local_700._0_4_;
      auVar92._4_4_ = (float)local_600._4_4_ + (float)local_700._4_4_;
      auVar92._8_4_ = fStack_5f8 + fStack_6f8;
      auVar92._12_4_ = fStack_5f4 + fStack_6f4;
      auVar92._16_4_ = fStack_5f0 + fStack_6f0;
      auVar92._20_4_ = fStack_5ec + fStack_6ec;
      auVar92._24_4_ = fStack_5e8 + fStack_6e8;
      auVar92._28_4_ = fStack_5e4 + fStack_6e4;
      fVar122 = (ray->super_RayK<1>).tfar;
      fVar96 = (ray->super_RayK<1>).tfar;
      auVar142._4_4_ = fVar96;
      auVar142._0_4_ = fVar96;
      auVar142._8_4_ = fVar96;
      auVar142._12_4_ = fVar96;
      auVar142._16_4_ = fVar96;
      auVar142._20_4_ = fVar96;
      auVar142._24_4_ = fVar96;
      auVar142._28_4_ = fVar96;
      auVar85 = vcmpps_avx(auVar92,auVar142,2);
      local_720 = vandps_avx(auVar85,local_720);
      auVar93._8_4_ = 3;
      auVar93._0_8_ = 0x300000003;
      auVar93._12_4_ = 3;
      auVar93._16_4_ = 3;
      auVar93._20_4_ = 3;
      auVar93._24_4_ = 3;
      auVar93._28_4_ = 3;
      auVar143._8_4_ = 2;
      auVar143._0_8_ = 0x200000002;
      auVar143._12_4_ = 2;
      auVar143._16_4_ = 2;
      auVar143._20_4_ = 2;
      auVar143._24_4_ = 2;
      auVar143._28_4_ = 2;
      auVar85 = vblendvps_avx(auVar143,auVar93,local_560);
      _local_740 = vpcmpgtd_avx2(auVar85,local_580);
      auVar85 = vpandn_avx2(_local_740,local_720);
      local_820 = _local_4a0;
      local_700._4_4_ = (float)local_600._4_4_ + (float)local_4a0._4_4_;
      local_700._0_4_ = (float)local_600._0_4_ + (float)local_4a0._0_4_;
      fStack_6f8 = fStack_5f8 + fStack_498;
      fStack_6f4 = fStack_5f4 + fStack_494;
      fStack_6f0 = fStack_5f0 + fStack_490;
      fStack_6ec = fStack_5ec + fStack_48c;
      fStack_6e8 = fStack_5e8 + fStack_488;
      fStack_6e4 = fStack_5e4 + fStack_484;
      auVar250 = ZEXT3264(local_8a0);
      auVar239 = ZEXT3264(local_8c0);
      auVar242 = ZEXT3264(local_8e0);
      while( true ) {
        local_5e0 = auVar85;
        if ((((((((auVar85 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar85 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar85 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar85 >> 0x7f,0) == '\0') &&
              (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar85 >> 0xbf,0) == '\0') &&
            (auVar85 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar85[0x1f]) break;
        auVar121._8_4_ = 0x7f800000;
        auVar121._0_8_ = 0x7f8000007f800000;
        auVar121._12_4_ = 0x7f800000;
        auVar121._16_4_ = 0x7f800000;
        auVar121._20_4_ = 0x7f800000;
        auVar121._24_4_ = 0x7f800000;
        auVar121._28_4_ = 0x7f800000;
        auVar240 = vblendvps_avx(auVar121,local_820,auVar85);
        auVar247 = vshufps_avx(auVar240,auVar240,0xb1);
        auVar247 = vminps_avx(auVar240,auVar247);
        auVar134 = vshufpd_avx(auVar247,auVar247,5);
        auVar247 = vminps_avx(auVar247,auVar134);
        auVar134 = vpermpd_avx2(auVar247,0x4e);
        auVar247 = vminps_avx(auVar247,auVar134);
        auVar240 = vcmpps_avx(auVar240,auVar247,0);
        auVar247 = auVar85 & auVar240;
        if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar247 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar247 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar247 >> 0x7f,0) != '\0') ||
              (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar247 >> 0xbf,0) != '\0') ||
            (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar247[0x1f] < '\0') {
          auVar85 = vandps_avx(auVar240,auVar85);
        }
        uVar60 = vmovmskps_avx(auVar85);
        iVar9 = 0;
        for (; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x80000000) {
          iVar9 = iVar9 + 1;
        }
        uVar63 = iVar9 << 2;
        *(undefined4 *)(local_5e0 + uVar63) = 0;
        aVar1 = (ray->super_RayK<1>).dir.field_0;
        local_7e0._0_16_ = (undefined1  [16])aVar1;
        auVar8 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
        uVar60 = *(uint *)(local_1c0 + uVar63);
        uVar63 = *(uint *)(local_480 + uVar63);
        if (auVar8._0_4_ < 0.0) {
          fVar96 = sqrtf(auVar8._0_4_);
          auVar242 = ZEXT3264(local_8e0);
          auVar225 = ZEXT3264(local_a40);
          auVar239 = ZEXT3264(local_8c0);
          auVar250 = ZEXT3264(local_8a0);
        }
        else {
          auVar8 = vsqrtss_avx(auVar8,auVar8);
          fVar96 = auVar8._0_4_;
        }
        auVar172 = vminps_avx(local_9b0,local_9d0);
        auVar8 = vmaxps_avx(local_9b0,local_9d0);
        auVar194 = vminps_avx(local_9c0,_local_9e0);
        auVar78 = vminps_avx(auVar172,auVar194);
        auVar172 = vmaxps_avx(local_9c0,_local_9e0);
        auVar194 = vmaxps_avx(auVar8,auVar172);
        auVar8 = vandps_avx(auVar78,local_9f0);
        auVar172 = vandps_avx(auVar194,local_9f0);
        auVar8 = vmaxps_avx(auVar8,auVar172);
        auVar172 = vmovshdup_avx(auVar8);
        auVar172 = vmaxss_avx(auVar172,auVar8);
        auVar8 = vshufpd_avx(auVar8,auVar8,1);
        auVar8 = vmaxss_avx(auVar8,auVar172);
        local_860._0_4_ = auVar8._0_4_ * 1.9073486e-06;
        local_7a0._0_4_ = fVar96 * 1.9073486e-06;
        local_6e0._0_16_ = vshufps_avx(auVar194,auVar194,0xff);
        auVar8 = vinsertps_avx(ZEXT416(uVar63),ZEXT416(uVar60),0x10);
        auVar222 = ZEXT1664(auVar8);
        lVar62 = 5;
        do {
          do {
            bVar68 = lVar62 == 0;
            lVar62 = lVar62 + -1;
            if (bVar68) goto LAB_0113ba9d;
            auVar218 = auVar222._0_16_;
            local_960._0_16_ = vmovshdup_avx(auVar218);
            fVar127 = 1.0 - local_960._0_4_;
            auVar8 = vshufps_avx(auVar218,auVar218,0x55);
            fVar96 = auVar8._0_4_;
            auVar105._0_4_ = local_9d0._0_4_ * fVar96;
            fVar122 = auVar8._4_4_;
            auVar105._4_4_ = local_9d0._4_4_ * fVar122;
            fVar123 = auVar8._8_4_;
            auVar105._8_4_ = local_9d0._8_4_ * fVar123;
            fVar124 = auVar8._12_4_;
            auVar105._12_4_ = local_9d0._12_4_ * fVar124;
            auVar132._4_4_ = fVar127;
            auVar132._0_4_ = fVar127;
            auVar132._8_4_ = fVar127;
            auVar132._12_4_ = fVar127;
            auVar8 = vfmadd231ps_fma(auVar105,auVar132,local_9b0);
            auVar153._0_4_ = local_9c0._0_4_ * fVar96;
            auVar153._4_4_ = local_9c0._4_4_ * fVar122;
            auVar153._8_4_ = local_9c0._8_4_ * fVar123;
            auVar153._12_4_ = local_9c0._12_4_ * fVar124;
            auVar172 = vfmadd231ps_fma(auVar153,auVar132,local_9d0);
            auVar196._0_4_ = fVar96 * auVar172._0_4_;
            auVar196._4_4_ = fVar122 * auVar172._4_4_;
            auVar196._8_4_ = fVar123 * auVar172._8_4_;
            auVar196._12_4_ = fVar124 * auVar172._12_4_;
            auVar194 = vfmadd231ps_fma(auVar196,auVar132,auVar8);
            auVar106._0_4_ = fVar96 * (float)local_9e0._0_4_;
            auVar106._4_4_ = fVar122 * (float)local_9e0._4_4_;
            auVar106._8_4_ = fVar123 * fStack_9d8;
            auVar106._12_4_ = fVar124 * fStack_9d4;
            auVar8 = vfmadd231ps_fma(auVar106,auVar132,local_9c0);
            auVar175._0_4_ = fVar96 * auVar8._0_4_;
            auVar175._4_4_ = fVar122 * auVar8._4_4_;
            auVar175._8_4_ = fVar123 * auVar8._8_4_;
            auVar175._12_4_ = fVar124 * auVar8._12_4_;
            auVar172 = vfmadd231ps_fma(auVar175,auVar132,auVar172);
            uVar66 = auVar222._0_4_;
            auVar107._4_4_ = uVar66;
            auVar107._0_4_ = uVar66;
            auVar107._8_4_ = uVar66;
            auVar107._12_4_ = uVar66;
            auVar8 = vfmadd213ps_fma(auVar107,local_7e0._0_16_,_DAT_01f45a50);
            auVar81._0_4_ = fVar96 * auVar172._0_4_;
            auVar81._4_4_ = fVar122 * auVar172._4_4_;
            auVar81._8_4_ = fVar123 * auVar172._8_4_;
            auVar81._12_4_ = fVar124 * auVar172._12_4_;
            auVar78 = vfmadd231ps_fma(auVar81,auVar194,auVar132);
            local_660._0_16_ = auVar78;
            auVar8 = vsubps_avx(auVar8,auVar78);
            _local_780 = auVar8;
            auVar8 = vdpps_avx(auVar8,auVar8,0x7f);
            fVar96 = auVar8._0_4_;
            if (fVar96 < 0.0) {
              local_980._0_16_ = ZEXT416((uint)fVar127);
              local_a20._0_16_ = auVar194;
              local_880._0_16_ = auVar172;
              auVar225._0_4_ = sqrtf(fVar96);
              auVar225._4_60_ = extraout_var_00;
              auVar222 = ZEXT1664(auVar218);
              auVar78 = auVar225._0_16_;
              auVar172 = local_880._0_16_;
              auVar194 = local_a20._0_16_;
              auVar73 = local_980._0_16_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar8,auVar8);
              auVar73 = ZEXT416((uint)fVar127);
            }
            auVar172 = vsubps_avx(auVar172,auVar194);
            auVar209._0_4_ = auVar172._0_4_ * 3.0;
            auVar209._4_4_ = auVar172._4_4_ * 3.0;
            auVar209._8_4_ = auVar172._8_4_ * 3.0;
            auVar209._12_4_ = auVar172._12_4_ * 3.0;
            auVar172 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar73,local_960._0_16_);
            auVar194 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_960._0_16_,auVar73);
            fVar122 = auVar73._0_4_ * 6.0;
            fVar123 = auVar172._0_4_ * 6.0;
            fVar124 = auVar194._0_4_ * 6.0;
            fVar127 = local_960._0_4_ * 6.0;
            auVar154._0_4_ = fVar127 * (float)local_9e0._0_4_;
            auVar154._4_4_ = fVar127 * (float)local_9e0._4_4_;
            auVar154._8_4_ = fVar127 * fStack_9d8;
            auVar154._12_4_ = fVar127 * fStack_9d4;
            auVar108._4_4_ = fVar124;
            auVar108._0_4_ = fVar124;
            auVar108._8_4_ = fVar124;
            auVar108._12_4_ = fVar124;
            auVar172 = vfmadd132ps_fma(auVar108,auVar154,local_9c0);
            auVar155._4_4_ = fVar123;
            auVar155._0_4_ = fVar123;
            auVar155._8_4_ = fVar123;
            auVar155._12_4_ = fVar123;
            auVar172 = vfmadd132ps_fma(auVar155,auVar172,local_9d0);
            auVar194 = vdpps_avx(auVar209,auVar209,0x7f);
            auVar109._4_4_ = fVar122;
            auVar109._0_4_ = fVar122;
            auVar109._8_4_ = fVar122;
            auVar109._12_4_ = fVar122;
            auVar72 = vfmadd132ps_fma(auVar109,auVar172,local_9b0);
            auVar172 = vblendps_avx(auVar194,_DAT_01f45a50,0xe);
            auVar73 = vrsqrtss_avx(auVar172,auVar172);
            fVar124 = auVar194._0_4_;
            fVar122 = auVar73._0_4_;
            auVar73 = vdpps_avx(auVar209,auVar72,0x7f);
            fVar122 = fVar122 * 1.5 + fVar124 * -0.5 * fVar122 * fVar122 * fVar122;
            auVar110._0_4_ = auVar72._0_4_ * fVar124;
            auVar110._4_4_ = auVar72._4_4_ * fVar124;
            auVar110._8_4_ = auVar72._8_4_ * fVar124;
            auVar110._12_4_ = auVar72._12_4_ * fVar124;
            fVar123 = auVar73._0_4_;
            auVar197._0_4_ = auVar209._0_4_ * fVar123;
            auVar197._4_4_ = auVar209._4_4_ * fVar123;
            auVar197._8_4_ = auVar209._8_4_ * fVar123;
            auVar197._12_4_ = auVar209._12_4_ * fVar123;
            auVar73 = vsubps_avx(auVar110,auVar197);
            auVar172 = vrcpss_avx(auVar172,auVar172);
            auVar72 = vfnmadd213ss_fma(auVar172,auVar194,ZEXT416(0x40000000));
            fVar123 = auVar172._0_4_ * auVar72._0_4_;
            auVar172 = vmaxss_avx(ZEXT416((uint)local_860._0_4_),
                                  ZEXT416((uint)(auVar222._0_4_ * (float)local_7a0._0_4_)));
            uVar64 = CONCAT44(auVar209._4_4_,auVar209._0_4_);
            auVar230._0_8_ = uVar64 ^ 0x8000000080000000;
            auVar230._8_4_ = -auVar209._8_4_;
            auVar230._12_4_ = -auVar209._12_4_;
            auVar156._0_4_ = fVar122 * auVar73._0_4_ * fVar123;
            auVar156._4_4_ = fVar122 * auVar73._4_4_ * fVar123;
            auVar156._8_4_ = fVar122 * auVar73._8_4_ * fVar123;
            auVar156._12_4_ = fVar122 * auVar73._12_4_ * fVar123;
            local_9a0._0_4_ = auVar209._0_4_ * fVar122;
            local_9a0._4_4_ = auVar209._4_4_ * fVar122;
            local_9a0._8_4_ = auVar209._8_4_ * fVar122;
            local_9a0._12_4_ = auVar209._12_4_ * fVar122;
            local_960._0_16_ = auVar209;
            local_980._0_4_ = auVar172._0_4_;
            if (fVar124 < -fVar124) {
              local_a20._0_4_ = auVar78._0_4_;
              local_880._0_16_ = auVar230;
              local_900._0_16_ = auVar156;
              fVar122 = sqrtf(fVar124);
              auVar78 = ZEXT416((uint)local_a20._0_4_);
              auVar172 = ZEXT416((uint)local_980._0_4_);
              auVar156 = local_900._0_16_;
              auVar230 = local_880._0_16_;
            }
            else {
              auVar194 = vsqrtss_avx(auVar194,auVar194);
              fVar122 = auVar194._0_4_;
            }
            local_a20._0_16_ = vdpps_avx(_local_780,local_9a0._0_16_,0x7f);
            auVar72 = vfmadd213ss_fma(ZEXT416((uint)local_860._0_4_),auVar78,auVar172);
            auVar172 = vdpps_avx(auVar230,local_9a0._0_16_,0x7f);
            auVar194 = vdpps_avx(_local_780,auVar156,0x7f);
            auVar73 = vdpps_avx(local_7e0._0_16_,local_9a0._0_16_,0x7f);
            auVar78 = vfmadd213ss_fma(ZEXT416((uint)(auVar78._0_4_ + 1.0)),
                                      ZEXT416((uint)((float)local_860._0_4_ / fVar122)),auVar72);
            local_880._0_4_ = auVar78._0_4_;
            auVar82._0_4_ = local_a20._0_4_ * local_a20._0_4_;
            auVar82._4_4_ = local_a20._4_4_ * local_a20._4_4_;
            auVar82._8_4_ = local_a20._8_4_ * local_a20._8_4_;
            auVar82._12_4_ = local_a20._12_4_ * local_a20._12_4_;
            auVar78 = vdpps_avx(_local_780,auVar230,0x7f);
            auVar130 = vsubps_avx(auVar8,auVar82);
            auVar72 = vrsqrtss_avx(auVar130,auVar130);
            fVar123 = auVar130._0_4_;
            fVar122 = auVar72._0_4_;
            fVar122 = fVar122 * 1.5 + fVar123 * -0.5 * fVar122 * fVar122 * fVar122;
            auVar72 = vdpps_avx(_local_780,local_7e0._0_16_,0x7f);
            local_9a0._0_16_ = ZEXT416((uint)(auVar172._0_4_ + auVar194._0_4_));
            auVar172 = vfnmadd231ss_fma(auVar78,local_a20._0_16_,local_9a0._0_16_);
            auVar194 = vfnmadd231ss_fma(auVar72,local_a20._0_16_,auVar73);
            if (fVar123 < 0.0) {
              local_900._0_16_ = auVar73;
              local_680._0_16_ = auVar172;
              local_6a0._0_4_ = fVar122;
              local_6c0._0_16_ = auVar194;
              fVar123 = sqrtf(fVar123);
              fVar122 = (float)local_6a0._0_4_;
              auVar194 = local_6c0._0_16_;
              auVar172 = local_680._0_16_;
              auVar73 = local_900._0_16_;
            }
            else {
              auVar78 = vsqrtss_avx(auVar130,auVar130);
              fVar123 = auVar78._0_4_;
            }
            auVar250 = ZEXT3264(local_8a0);
            auVar239 = ZEXT3264(local_8c0);
            auVar225 = ZEXT3264(local_a40);
            auVar242 = ZEXT3264(local_8e0);
            auVar78 = vpermilps_avx(local_660._0_16_,0xff);
            fVar123 = fVar123 - auVar78._0_4_;
            auVar78 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xff);
            auVar172 = vfmsub213ss_fma(auVar172,ZEXT416((uint)fVar122),auVar78);
            auVar157._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar157._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar157._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar176._0_8_ = auVar172._0_8_ ^ 0x8000000080000000;
            auVar176._8_4_ = auVar172._8_4_ ^ 0x80000000;
            auVar176._12_4_ = auVar172._12_4_ ^ 0x80000000;
            auVar72 = ZEXT416((uint)(auVar194._0_4_ * fVar122));
            auVar194 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar172._0_4_)),
                                       local_9a0._0_16_,auVar72);
            auVar172 = vinsertps_avx(auVar176,auVar72,0x1c);
            uVar66 = auVar194._0_4_;
            auVar177._4_4_ = uVar66;
            auVar177._0_4_ = uVar66;
            auVar177._8_4_ = uVar66;
            auVar177._12_4_ = uVar66;
            auVar172 = vdivps_avx(auVar172,auVar177);
            auVar194 = vinsertps_avx(local_9a0._0_16_,auVar157,0x10);
            auVar194 = vdivps_avx(auVar194,auVar177);
            fVar122 = local_a20._0_4_;
            auVar133._0_4_ = fVar122 * auVar172._0_4_ + fVar123 * auVar194._0_4_;
            auVar133._4_4_ = fVar122 * auVar172._4_4_ + fVar123 * auVar194._4_4_;
            auVar133._8_4_ = fVar122 * auVar172._8_4_ + fVar123 * auVar194._8_4_;
            auVar133._12_4_ = fVar122 * auVar172._12_4_ + fVar123 * auVar194._12_4_;
            auVar194 = vsubps_avx(auVar218,auVar133);
            auVar222 = ZEXT1664(auVar194);
            auVar172 = vandps_avx(local_a20._0_16_,local_9f0);
          } while ((float)local_880._0_4_ <= auVar172._0_4_);
          auVar218 = vfmadd231ss_fma(ZEXT416((uint)((float)local_880._0_4_ + (float)local_980._0_4_)
                                            ),local_6e0._0_16_,ZEXT416(0x36000000));
          auVar172 = vandps_avx(ZEXT416((uint)fVar123),local_9f0);
        } while (auVar218._0_4_ <= auVar172._0_4_);
        fVar122 = auVar194._0_4_ + (float)local_760._0_4_;
        if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar122) &&
           (fVar123 = (ray->super_RayK<1>).tfar, fVar122 <= fVar123)) {
          auVar172 = vmovshdup_avx(auVar194);
          fVar124 = auVar172._0_4_;
          if ((0.0 <= fVar124) && (fVar124 <= 1.0)) {
            auVar8 = vrsqrtss_avx(auVar8,auVar8);
            fVar127 = auVar8._0_4_;
            pGVar4 = (context->scene->geometries).items[uVar67].ptr;
            if ((pGVar4->mask & (ray->super_RayK<1>).mask) != 0) {
              fVar96 = fVar127 * 1.5 + fVar96 * -0.5 * fVar127 * fVar127 * fVar127;
              auVar158._0_4_ = fVar96 * (float)local_780._0_4_;
              auVar158._4_4_ = fVar96 * (float)local_780._4_4_;
              auVar158._8_4_ = fVar96 * fStack_778;
              auVar158._12_4_ = fVar96 * fStack_774;
              auVar78 = vfmadd213ps_fma(auVar78,auVar158,local_960._0_16_);
              auVar8 = vshufps_avx(auVar158,auVar158,0xc9);
              auVar172 = vshufps_avx(local_960._0_16_,local_960._0_16_,0xc9);
              auVar159._0_4_ = auVar158._0_4_ * auVar172._0_4_;
              auVar159._4_4_ = auVar158._4_4_ * auVar172._4_4_;
              auVar159._8_4_ = auVar158._8_4_ * auVar172._8_4_;
              auVar159._12_4_ = auVar158._12_4_ * auVar172._12_4_;
              auVar194 = vfmsub231ps_fma(auVar159,local_960._0_16_,auVar8);
              auVar8 = vshufps_avx(auVar194,auVar194,0xc9);
              auVar172 = vshufps_avx(auVar78,auVar78,0xc9);
              auVar194 = vshufps_avx(auVar194,auVar194,0xd2);
              auVar83._0_4_ = auVar78._0_4_ * auVar194._0_4_;
              auVar83._4_4_ = auVar78._4_4_ * auVar194._4_4_;
              auVar83._8_4_ = auVar78._8_4_ * auVar194._8_4_;
              auVar83._12_4_ = auVar78._12_4_ * auVar194._12_4_;
              auVar172 = vfmsub231ps_fma(auVar83,auVar8,auVar172);
              auVar8 = vshufps_avx(auVar172,auVar172,0xe9);
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = fVar122;
                uVar69 = vmovlps_avx(auVar8);
                *(undefined8 *)&(ray->Ng).field_0 = uVar69;
                (ray->Ng).field_0.field_0.z = auVar172._0_4_;
                ray->u = fVar124;
                ray->v = 0.0;
                ray->primID = (uint)local_840;
                ray->geomID = uVar67;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
              else {
                local_930 = vmovlps_avx(auVar8);
                local_928 = auVar172._0_4_;
                local_924 = fVar124;
                local_920 = 0;
                local_91c = (uint)local_840;
                local_918 = uVar67;
                local_914 = context->user->instID[0];
                local_910 = context->user->instPrimID[0];
                (ray->super_RayK<1>).tfar = fVar122;
                local_a44 = -1;
                local_a78.valid = &local_a44;
                local_a78.geometryUserPtr = pGVar4->userPtr;
                local_a78.context = context->user;
                local_a78.hit = (RTCHitN *)&local_930;
                local_a78.N = 1;
                local_a78.ray = (RTCRayN *)ray;
                if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113bbcb:
                  p_Var6 = context->args->filter;
                  if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var6)(&local_a78);
                    auVar242 = ZEXT3264(local_8e0);
                    auVar225 = ZEXT3264(local_a40);
                    auVar239 = ZEXT3264(local_8c0);
                    auVar250 = ZEXT3264(local_8a0);
                    if (*local_a78.valid == 0) goto LAB_0113bc8c;
                  }
                  (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).components[0] =
                       *(float *)local_a78.hit;
                  (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_a78.hit + 4);
                  (((Vec3f *)((long)local_a78.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_a78.hit + 8);
                  *(float *)((long)local_a78.ray + 0x3c) = *(float *)(local_a78.hit + 0xc);
                  *(float *)((long)local_a78.ray + 0x40) = *(float *)(local_a78.hit + 0x10);
                  *(float *)((long)local_a78.ray + 0x44) = *(float *)(local_a78.hit + 0x14);
                  *(float *)((long)local_a78.ray + 0x48) = *(float *)(local_a78.hit + 0x18);
                  *(float *)((long)local_a78.ray + 0x4c) = *(float *)(local_a78.hit + 0x1c);
                  *(float *)((long)local_a78.ray + 0x50) = *(float *)(local_a78.hit + 0x20);
                }
                else {
                  (*pGVar4->intersectionFilterN)(&local_a78);
                  auVar242 = ZEXT3264(local_8e0);
                  auVar225 = ZEXT3264(local_a40);
                  auVar239 = ZEXT3264(local_8c0);
                  auVar250 = ZEXT3264(local_8a0);
                  if (*local_a78.valid != 0) goto LAB_0113bbcb;
LAB_0113bc8c:
                  (ray->super_RayK<1>).tfar = fVar123;
                }
              }
            }
          }
        }
LAB_0113ba9d:
        fVar96 = (ray->super_RayK<1>).tfar;
        auVar94._4_4_ = fVar96;
        auVar94._0_4_ = fVar96;
        auVar94._8_4_ = fVar96;
        auVar94._12_4_ = fVar96;
        auVar94._16_4_ = fVar96;
        auVar94._20_4_ = fVar96;
        auVar94._24_4_ = fVar96;
        auVar94._28_4_ = fVar96;
        fVar122 = (ray->super_RayK<1>).tfar;
        auVar85 = vcmpps_avx(_local_700,auVar94,2);
        auVar85 = vandps_avx(auVar85,local_5e0);
      }
      auVar144._0_4_ = (float)local_600._0_4_ + local_460._0_4_;
      auVar144._4_4_ = (float)local_600._4_4_ + local_460._4_4_;
      auVar144._8_4_ = fStack_5f8 + local_460._8_4_;
      auVar144._12_4_ = fStack_5f4 + local_460._12_4_;
      auVar144._16_4_ = fStack_5f0 + local_460._16_4_;
      auVar144._20_4_ = fStack_5ec + local_460._20_4_;
      auVar144._24_4_ = fStack_5e8 + local_460._24_4_;
      auVar144._28_4_ = fStack_5e4 + local_460._28_4_;
      auVar163._4_4_ = fVar122;
      auVar163._0_4_ = fVar122;
      auVar163._8_4_ = fVar122;
      auVar163._12_4_ = fVar122;
      auVar163._16_4_ = fVar122;
      auVar163._20_4_ = fVar122;
      auVar163._24_4_ = fVar122;
      auVar163._28_4_ = fVar122;
      auVar240 = vcmpps_avx(auVar144,auVar163,2);
      auVar85 = vandps_avx(local_540,local_520);
      auVar85 = vandps_avx(auVar240,auVar85);
      auVar186._0_4_ = (float)local_600._0_4_ + local_4a0._0_4_;
      auVar186._4_4_ = (float)local_600._4_4_ + local_4a0._4_4_;
      auVar186._8_4_ = fStack_5f8 + local_4a0._8_4_;
      auVar186._12_4_ = fStack_5f4 + local_4a0._12_4_;
      auVar186._16_4_ = fStack_5f0 + local_4a0._16_4_;
      auVar186._20_4_ = fStack_5ec + local_4a0._20_4_;
      auVar186._24_4_ = fStack_5e8 + local_4a0._24_4_;
      auVar186._28_4_ = fStack_5e4 + local_4a0._28_4_;
      auVar247 = vcmpps_avx(auVar186,auVar163,2);
      auVar240 = vandps_avx(_local_740,local_720);
      auVar240 = vandps_avx(auVar247,auVar240);
      auVar240 = vorps_avx(auVar85,auVar240);
      if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar240 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar240 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar240 >> 0x7f,0) != '\0') ||
            (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar240 >> 0xbf,0) != '\0') ||
          (auVar240 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar240[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar65 * 0x60) = auVar240;
        auVar85 = vblendvps_avx(_local_4a0,local_460,auVar85);
        *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x60) = auVar85;
        uVar64 = vmovlps_avx(local_4b0);
        (&uStack_140)[uVar65 * 0xc] = uVar64;
        aiStack_138[uVar65 * 0x18] = local_aec + 1;
        uVar65 = (ulong)((int)uVar65 + 1);
      }
      auVar248 = auVar250._0_32_;
      auVar241 = auVar239._0_32_;
      auVar134 = auVar242._0_32_;
    }
    auVar137 = local_320;
    auVar240 = local_340;
    auVar247 = local_400;
    fVar122 = (ray->super_RayK<1>).tfar;
    fVar96 = (ray->super_RayK<1>).tfar;
    auVar140._4_4_ = fVar96;
    auVar140._0_4_ = fVar96;
    auVar140._8_4_ = fVar96;
    auVar140._12_4_ = fVar96;
    auVar140._16_4_ = fVar96;
    auVar140._20_4_ = fVar96;
    auVar140._24_4_ = fVar96;
    auVar140._28_4_ = fVar96;
    while( true ) {
      uVar60 = (uint)uVar65;
      if (uVar60 == 0) {
        auVar84._4_4_ = fVar122;
        auVar84._0_4_ = fVar122;
        auVar84._8_4_ = fVar122;
        auVar84._12_4_ = fVar122;
        auVar8 = vcmpps_avx(local_4c0,auVar84,2);
        uVar67 = vmovmskps_avx(auVar8);
        uVar61 = (ulong)(uVar67 & (uint)uVar61 - 1 & (uint)uVar61);
        auVar239 = ZEXT3264(_DAT_01f7b040);
        goto LAB_0113989b;
      }
      uVar64 = (ulong)(uVar60 - 1);
      lVar62 = uVar64 * 0x60;
      auVar85 = *(undefined1 (*) [32])(auStack_160 + lVar62);
      auVar117._0_4_ = auVar85._0_4_ + (float)local_600._0_4_;
      auVar117._4_4_ = auVar85._4_4_ + (float)local_600._4_4_;
      auVar117._8_4_ = auVar85._8_4_ + fStack_5f8;
      auVar117._12_4_ = auVar85._12_4_ + fStack_5f4;
      auVar117._16_4_ = auVar85._16_4_ + fStack_5f0;
      auVar117._20_4_ = auVar85._20_4_ + fStack_5ec;
      auVar117._24_4_ = auVar85._24_4_ + fStack_5e8;
      auVar117._28_4_ = auVar85._28_4_ + fStack_5e4;
      auVar178 = vcmpps_avx(auVar117,auVar140,2);
      auVar111 = vandps_avx(auVar178,*(undefined1 (*) [32])(auStack_180 + lVar62));
      local_460 = auVar111;
      auVar178 = *(undefined1 (*) [32])(auStack_180 + lVar62) & auVar178;
      if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar178 >> 0x7f,0) != '\0') ||
            (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar178 >> 0xbf,0) != '\0') ||
          (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar178[0x1f] < '\0') break;
      uVar65 = (ulong)(uVar60 - 1);
    }
    auVar88._8_4_ = 0x7f800000;
    auVar88._0_8_ = 0x7f8000007f800000;
    auVar88._12_4_ = 0x7f800000;
    auVar88._16_4_ = 0x7f800000;
    auVar88._20_4_ = 0x7f800000;
    auVar88._24_4_ = 0x7f800000;
    auVar88._28_4_ = 0x7f800000;
    auVar85 = vblendvps_avx(auVar88,auVar85,auVar111);
    auVar178 = vshufps_avx(auVar85,auVar85,0xb1);
    auVar178 = vminps_avx(auVar85,auVar178);
    auVar116 = vshufpd_avx(auVar178,auVar178,5);
    auVar178 = vminps_avx(auVar178,auVar116);
    auVar116 = vpermpd_avx2(auVar178,0x4e);
    auVar178 = vminps_avx(auVar178,auVar116);
    auVar85 = vcmpps_avx(auVar85,auVar178,0);
    auVar178 = auVar111 & auVar85;
    if ((((((((auVar178 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar178 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar178 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar178 >> 0x7f,0) != '\0') ||
          (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar178 >> 0xbf,0) != '\0') ||
        (auVar178 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar178[0x1f] < '\0') {
      auVar111 = vandps_avx(auVar85,auVar111);
    }
    uVar63 = vmovmskps_avx(auVar111);
    iVar9 = 0;
    for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x80000000) {
      iVar9 = iVar9 + 1;
    }
    *(undefined4 *)(local_460 + (uint)(iVar9 << 2)) = 0;
    uVar65 = (&uStack_140)[uVar64 * 0xc];
    auVar76._8_8_ = 0;
    auVar76._0_8_ = uVar65;
    local_aec = aiStack_138[uVar64 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar62) = local_460;
    uVar63 = uVar60 - 1;
    if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_460 >> 0x7f,0) != '\0') ||
          (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_460 >> 0xbf,0) != '\0') ||
        (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_460[0x1f] < '\0') {
      uVar63 = uVar60;
    }
    uVar66 = (undefined4)uVar65;
    auVar118._4_4_ = uVar66;
    auVar118._0_4_ = uVar66;
    auVar118._8_4_ = uVar66;
    auVar118._12_4_ = uVar66;
    auVar118._16_4_ = uVar66;
    auVar118._20_4_ = uVar66;
    auVar118._24_4_ = uVar66;
    auVar118._28_4_ = uVar66;
    auVar8 = vmovshdup_avx(auVar76);
    auVar8 = vsubps_avx(auVar8,auVar76);
    auVar89._0_4_ = auVar8._0_4_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar89._16_4_ = auVar89._0_4_;
    auVar89._20_4_ = auVar89._0_4_;
    auVar89._24_4_ = auVar89._0_4_;
    auVar89._28_4_ = auVar89._0_4_;
    auVar239 = ZEXT3264(_DAT_01f7b040);
    auVar8 = vfmadd132ps_fma(auVar89,auVar118,_DAT_01f7b040);
    _local_4a0 = ZEXT1632(auVar8);
    local_4b0._8_8_ = 0;
    local_4b0._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar9 << 2));
    uVar65 = (ulong)uVar63;
    auVar178 = auVar225._0_32_;
    uVar64 = local_840;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }